

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  bool bVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  long lVar58;
  byte bVar59;
  uint uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  float fVar64;
  undefined4 uVar65;
  float fVar66;
  vint4 bi_2;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  vint4 bi_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar87 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar98 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar110;
  float fVar124;
  vint4 ai_2;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  vint4 ai;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar159;
  float fVar161;
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar163;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar160;
  float fVar162;
  float fVar164;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar165;
  float fVar166;
  undefined1 auVar158 [32];
  undefined8 uVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar182;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar183;
  undefined1 auVar181 [32];
  float fVar187;
  float fVar204;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  vint4 ai_1;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar209 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  float fVar221;
  float fVar230;
  vfloat4 a0_3;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  float fVar231;
  float fVar242;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  vfloat4 a0_1;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  vfloat4 a0;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar259;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar269;
  float fVar270;
  undefined1 auVar260 [16];
  float fVar271;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar275 [16];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar281 [16];
  undefined1 auVar285 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_549;
  undefined4 local_548;
  undefined1 local_4e8 [16];
  int local_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  float local_488;
  float fStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  undefined4 uStack_46c;
  undefined1 local_468 [32];
  undefined1 local_448 [16];
  ulong local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  undefined8 uStack_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  ulong local_338;
  Primitive *local_330;
  RTCFilterFunctionNArguments local_328;
  uint auStack_2f8 [4];
  undefined8 local_2e8;
  undefined4 local_2e0;
  undefined8 local_2dc;
  undefined4 local_2d4;
  undefined4 local_2d0;
  uint local_2cc;
  uint local_2c8;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  uint uStack_1d8;
  float afStack_1d4 [7];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar57;
  undefined1 auVar121 [32];
  
  PVar4 = prim[1];
  uVar63 = (ulong)(byte)PVar4;
  fVar142 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  auVar13 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar144._0_4_ = fVar142 * (ray->dir).field_0.m128[0];
  auVar144._4_4_ = fVar142 * (ray->dir).field_0.m128[1];
  auVar144._8_4_ = fVar142 * (ray->dir).field_0.m128[2];
  auVar144._12_4_ = fVar142 * (ray->dir).field_0.m128[3];
  auVar67._0_4_ = fVar142 * auVar13._0_4_;
  auVar67._4_4_ = fVar142 * auVar13._4_4_;
  auVar67._8_4_ = fVar142 * auVar13._8_4_;
  auVar67._12_4_ = fVar142 * auVar13._12_4_;
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar274 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar274 = vcvtdq2ps_avx(auVar274);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar63 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar56 = (ulong)(uint)((int)(uVar63 * 9) * 2);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + uVar63 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  uVar56 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar272._4_4_ = auVar144._0_4_;
  auVar272._0_4_ = auVar144._0_4_;
  auVar272._8_4_ = auVar144._0_4_;
  auVar272._12_4_ = auVar144._0_4_;
  auVar84 = vshufps_avx(auVar144,auVar144,0x55);
  auVar68 = vshufps_avx(auVar144,auVar144,0xaa);
  fVar142 = auVar68._0_4_;
  auVar243._0_4_ = fVar142 * auVar274._0_4_;
  fVar160 = auVar68._4_4_;
  auVar243._4_4_ = fVar160 * auVar274._4_4_;
  fVar162 = auVar68._8_4_;
  auVar243._8_4_ = fVar162 * auVar274._8_4_;
  fVar164 = auVar68._12_4_;
  auVar243._12_4_ = fVar164 * auVar274._12_4_;
  auVar232._0_4_ = auVar12._0_4_ * fVar142;
  auVar232._4_4_ = auVar12._4_4_ * fVar160;
  auVar232._8_4_ = auVar12._8_4_ * fVar162;
  auVar232._12_4_ = auVar12._12_4_ * fVar164;
  auVar205._0_4_ = auVar97._0_4_ * fVar142;
  auVar205._4_4_ = auVar97._4_4_ * fVar160;
  auVar205._8_4_ = auVar97._8_4_ * fVar162;
  auVar205._12_4_ = auVar97._12_4_ * fVar164;
  auVar68 = vfmadd231ps_fma(auVar243,auVar84,auVar9);
  auVar212 = vfmadd231ps_fma(auVar232,auVar84,auVar11);
  auVar84 = vfmadd231ps_fma(auVar205,auVar69,auVar84);
  auVar85 = vfmadd231ps_fma(auVar68,auVar272,auVar13);
  auVar212 = vfmadd231ps_fma(auVar212,auVar272,auVar10);
  auVar126 = vfmadd231ps_fma(auVar84,auVar70,auVar272);
  auVar273._4_4_ = auVar67._0_4_;
  auVar273._0_4_ = auVar67._0_4_;
  auVar273._8_4_ = auVar67._0_4_;
  auVar273._12_4_ = auVar67._0_4_;
  auVar84 = vshufps_avx(auVar67,auVar67,0x55);
  auVar68 = vshufps_avx(auVar67,auVar67,0xaa);
  fVar142 = auVar68._0_4_;
  auVar145._0_4_ = fVar142 * auVar274._0_4_;
  fVar160 = auVar68._4_4_;
  auVar145._4_4_ = fVar160 * auVar274._4_4_;
  fVar162 = auVar68._8_4_;
  auVar145._8_4_ = fVar162 * auVar274._8_4_;
  fVar164 = auVar68._12_4_;
  auVar145._12_4_ = fVar164 * auVar274._12_4_;
  auVar131._0_4_ = auVar12._0_4_ * fVar142;
  auVar131._4_4_ = auVar12._4_4_ * fVar160;
  auVar131._8_4_ = auVar12._8_4_ * fVar162;
  auVar131._12_4_ = auVar12._12_4_ * fVar164;
  auVar68._0_4_ = auVar97._0_4_ * fVar142;
  auVar68._4_4_ = auVar97._4_4_ * fVar160;
  auVar68._8_4_ = auVar97._8_4_ * fVar162;
  auVar68._12_4_ = auVar97._12_4_ * fVar164;
  auVar9 = vfmadd231ps_fma(auVar145,auVar84,auVar9);
  auVar274 = vfmadd231ps_fma(auVar131,auVar84,auVar11);
  auVar11 = vfmadd231ps_fma(auVar68,auVar84,auVar69);
  auVar12 = vfmadd231ps_fma(auVar9,auVar273,auVar13);
  auVar69 = vfmadd231ps_fma(auVar274,auVar273,auVar10);
  auVar97 = vfmadd231ps_fma(auVar11,auVar273,auVar70);
  local_358._8_4_ = 0x7fffffff;
  local_358._0_8_ = 0x7fffffff7fffffff;
  local_358._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar85,local_358);
  auVar125._8_4_ = 0x219392ef;
  auVar125._0_8_ = 0x219392ef219392ef;
  auVar125._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar125,1);
  auVar9 = vblendvps_avx(auVar85,auVar125,auVar13);
  auVar13 = vandps_avx(auVar212,local_358);
  auVar13 = vcmpps_avx(auVar13,auVar125,1);
  auVar274 = vblendvps_avx(auVar212,auVar125,auVar13);
  auVar13 = vandps_avx(auVar126,local_358);
  auVar13 = vcmpps_avx(auVar13,auVar125,1);
  auVar13 = vblendvps_avx(auVar126,auVar125,auVar13);
  auVar10 = vrcpps_avx(auVar9);
  auVar188._8_4_ = 0x3f800000;
  auVar188._0_8_ = &DAT_3f8000003f800000;
  auVar188._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar188);
  auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9 = vrcpps_avx(auVar274);
  auVar274 = vfnmadd213ps_fma(auVar274,auVar9,auVar188);
  auVar11 = vfmadd132ps_fma(auVar274,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar13);
  auVar274 = vfnmadd213ps_fma(auVar13,auVar9,auVar188);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar70 = vfmadd132ps_fma(auVar274,auVar9,auVar9);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar126._0_4_ = auVar10._0_4_ * auVar13._0_4_;
  auVar126._4_4_ = auVar10._4_4_ * auVar13._4_4_;
  auVar126._8_4_ = auVar10._8_4_ * auVar13._8_4_;
  auVar126._12_4_ = auVar10._12_4_ * auVar13._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar13 = vpmovsxwd_avx(auVar9);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar146._0_4_ = auVar10._0_4_ * auVar13._0_4_;
  auVar146._4_4_ = auVar10._4_4_ * auVar13._4_4_;
  auVar146._8_4_ = auVar10._8_4_ * auVar13._8_4_;
  auVar146._12_4_ = auVar10._12_4_ * auVar13._12_4_;
  auVar212._1_3_ = 0;
  auVar212[0] = PVar4;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar274);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar63 * -2 + 6);
  auVar13 = vpmovsxwd_avx(auVar10);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar69);
  auVar206._0_4_ = auVar13._0_4_ * auVar11._0_4_;
  auVar206._4_4_ = auVar13._4_4_ * auVar11._4_4_;
  auVar206._8_4_ = auVar13._8_4_ * auVar11._8_4_;
  auVar206._12_4_ = auVar13._12_4_ * auVar11._12_4_;
  auVar13 = vcvtdq2ps_avx(auVar9);
  auVar13 = vsubps_avx(auVar13,auVar69);
  auVar84._0_4_ = auVar11._0_4_ * auVar13._0_4_;
  auVar84._4_4_ = auVar11._4_4_ * auVar13._4_4_;
  auVar84._8_4_ = auVar11._8_4_ * auVar13._8_4_;
  auVar84._12_4_ = auVar11._12_4_ * auVar13._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar56 + uVar63 + 6);
  auVar13 = vpmovsxwd_avx(auVar11);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar97);
  auVar85._0_4_ = auVar70._0_4_ * auVar13._0_4_;
  auVar85._4_4_ = auVar70._4_4_ * auVar13._4_4_;
  auVar85._8_4_ = auVar70._8_4_ * auVar13._8_4_;
  auVar85._12_4_ = auVar70._12_4_ * auVar13._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar63 * 0x17 + 6);
  auVar13 = vpmovsxwd_avx(auVar12);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar97);
  auVar69._0_4_ = auVar70._0_4_ * auVar13._0_4_;
  auVar69._4_4_ = auVar70._4_4_ * auVar13._4_4_;
  auVar69._8_4_ = auVar70._8_4_ * auVar13._8_4_;
  auVar69._12_4_ = auVar70._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar126,auVar146);
  auVar9 = vpminsd_avx(auVar206,auVar84);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  auVar9 = vpminsd_avx(auVar85,auVar69);
  uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar222._4_4_ = uVar65;
  auVar222._0_4_ = uVar65;
  auVar222._8_4_ = uVar65;
  auVar222._12_4_ = uVar65;
  auVar9 = vmaxps_avx(auVar9,auVar222);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  local_278._0_4_ = auVar13._0_4_ * 0.99999964;
  local_278._4_4_ = auVar13._4_4_ * 0.99999964;
  local_278._8_4_ = auVar13._8_4_ * 0.99999964;
  local_278._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar126,auVar146);
  auVar9 = vpmaxsd_avx(auVar206,auVar84);
  auVar13 = vminps_avx(auVar13,auVar9);
  auVar9 = vpmaxsd_avx(auVar85,auVar69);
  fVar142 = ray->tfar;
  auVar97._4_4_ = fVar142;
  auVar97._0_4_ = fVar142;
  auVar97._8_4_ = fVar142;
  auVar97._12_4_ = fVar142;
  auVar9 = vminps_avx(auVar9,auVar97);
  auVar13 = vminps_avx(auVar13,auVar9);
  auVar70._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar70._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar70._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar70._12_4_ = auVar13._12_4_ * 1.0000004;
  auVar212[4] = PVar4;
  auVar212._5_3_ = 0;
  auVar212[8] = PVar4;
  auVar212._9_3_ = 0;
  auVar212[0xc] = PVar4;
  auVar212._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar212,_DAT_01ff0cf0);
  auVar13 = vcmpps_avx(local_278,auVar70,2);
  auVar13 = vandps_avx(auVar13,auVar9);
  uVar54 = vmovmskps_avx(auVar13);
  local_549 = uVar54 != 0;
  if (uVar54 == 0) {
    return local_549;
  }
  uVar54 = uVar54 & 0xff;
  auVar83._16_16_ = mm_lookupmask_ps._240_16_;
  auVar83._0_16_ = mm_lookupmask_ps._240_16_;
  local_1f8 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,0x80);
  local_368 = 0x80000000;
  uStack_364 = 0x80000000;
  uStack_360 = 0x80000000;
  uStack_35c = 0x80000000;
  local_330 = prim;
LAB_0167da27:
  lVar58 = 0;
  uVar63 = (ulong)uVar54;
  for (uVar56 = uVar63; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  local_430 = (ulong)*(uint *)(local_330 + 2);
  local_338 = (ulong)*(uint *)(local_330 + lVar58 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_430].ptr;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_338);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar12 = *(undefined1 (*) [16])(_Var8 + uVar56 * (long)pvVar7);
  auVar13 = *(undefined1 (*) [16])(_Var8 + (uVar56 + 1) * (long)pvVar7);
  auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar56 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar56 + 3));
  fVar142 = *pfVar1;
  fVar160 = pfVar1[1];
  fVar162 = pfVar1[2];
  fVar164 = pfVar1[3];
  lVar58 = *(long *)&pGVar5[1].time_range.upper;
  auVar274 = *(undefined1 (*) [16])(lVar58 + (long)p_Var6 * uVar56);
  auVar10 = *(undefined1 (*) [16])(lVar58 + (long)p_Var6 * (uVar56 + 1));
  auVar11 = *(undefined1 (*) [16])(lVar58 + (long)p_Var6 * (uVar56 + 2));
  uVar63 = uVar63 - 1 & uVar63;
  pfVar1 = (float *)(lVar58 + (long)p_Var6 * (uVar56 + 3));
  fVar64 = *pfVar1;
  fVar66 = pfVar1[1];
  fVar143 = pfVar1[2];
  fVar182 = pfVar1[3];
  if (uVar63 != 0) {
    uVar62 = uVar63 - 1 & uVar63;
    for (uVar56 = uVar63; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    }
    if (uVar62 != 0) {
      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar71._0_4_ = fVar64 * 0.0;
  auVar71._4_4_ = fVar66 * 0.0;
  auVar71._8_4_ = fVar143 * 0.0;
  auVar71._12_4_ = fVar182 * 0.0;
  auVar260._8_4_ = 0x3e2aaaab;
  auVar260._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar260._12_4_ = 0x3e2aaaab;
  auVar70 = vfmadd213ps_fma(auVar260,auVar11,auVar71);
  auVar111._8_4_ = 0x3f2aaaab;
  auVar111._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar111._12_4_ = 0x3f2aaaab;
  auVar70 = vfmadd231ps_fma(auVar70,auVar10,auVar111);
  auVar69 = vfmadd231ps_fma(auVar70,auVar274,auVar260);
  auVar189._8_4_ = 0x3f000000;
  auVar189._0_8_ = 0x3f0000003f000000;
  auVar189._12_4_ = 0x3f000000;
  auVar70 = vfmadd231ps_fma(auVar71,auVar11,auVar189);
  auVar70 = vfnmadd231ps_fma(auVar70,auVar10,ZEXT816(0) << 0x40);
  auVar84 = vfnmadd231ps_fma(auVar70,auVar274,auVar189);
  auVar244._0_4_ = fVar142 * 0.0;
  auVar244._4_4_ = fVar160 * 0.0;
  auVar244._8_4_ = fVar162 * 0.0;
  auVar244._12_4_ = fVar164 * 0.0;
  auVar70 = vfmadd213ps_fma(auVar260,auVar9,auVar244);
  auVar70 = vfmadd231ps_fma(auVar70,auVar13,auVar111);
  auVar70 = vfmadd231ps_fma(auVar70,auVar12,auVar260);
  auVar97 = vfmadd231ps_fma(auVar244,auVar9,auVar189);
  auVar97 = vfnmadd231ps_fma(auVar97,auVar13,ZEXT816(0) << 0x40);
  auVar68 = vfnmadd231ps_fma(auVar97,auVar12,auVar189);
  auVar280._0_4_ = fVar64 * 0.16666667;
  auVar280._4_4_ = fVar66 * 0.16666667;
  auVar280._8_4_ = fVar143 * 0.16666667;
  auVar280._12_4_ = fVar182 * 0.16666667;
  auVar112._8_4_ = 0x3f2aaaab;
  auVar112._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar112._12_4_ = 0x3f2aaaab;
  auVar97 = vfmadd231ps_fma(auVar280,auVar11,auVar112);
  auVar97 = vfmadd231ps_fma(auVar97,auVar10,auVar260);
  auVar85 = ZEXT816(0) << 0x20;
  auVar97 = vfmadd231ps_fma(auVar97,auVar274,auVar85);
  auVar113._0_4_ = fVar64 * 0.5;
  auVar113._4_4_ = fVar66 * 0.5;
  auVar113._8_4_ = fVar143 * 0.5;
  auVar113._12_4_ = fVar182 * 0.5;
  auVar11 = vfmadd231ps_fma(auVar113,auVar85,auVar11);
  auVar10 = vfnmadd231ps_fma(auVar11,auVar189,auVar10);
  auVar212 = vfnmadd231ps_fma(auVar10,auVar85,auVar274);
  auVar207._0_4_ = fVar142 * 0.16666667;
  auVar207._4_4_ = fVar160 * 0.16666667;
  auVar207._8_4_ = fVar162 * 0.16666667;
  auVar207._12_4_ = fVar164 * 0.16666667;
  auVar223._8_4_ = 0x3f2aaaab;
  auVar223._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar223._12_4_ = 0x3f2aaaab;
  auVar274 = vfmadd231ps_fma(auVar207,auVar9,auVar223);
  auVar274 = vfmadd231ps_fma(auVar274,auVar13,auVar260);
  auVar11 = vfmadd231ps_fma(auVar274,auVar12,auVar85);
  auVar224._0_4_ = fVar142 * 0.5;
  auVar224._4_4_ = fVar160 * 0.5;
  auVar224._8_4_ = fVar162 * 0.5;
  auVar224._12_4_ = fVar164 * 0.5;
  auVar9 = vfmadd231ps_fma(auVar224,auVar85,auVar9);
  auVar13 = vfnmadd231ps_fma(auVar9,auVar189,auVar13);
  auVar12 = vfnmadd231ps_fma(auVar13,auVar85,auVar12);
  auVar13 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar9 = vshufps_avx(auVar70,auVar70,0xc9);
  fVar64 = auVar84._0_4_;
  auVar147._0_4_ = fVar64 * auVar9._0_4_;
  fVar66 = auVar84._4_4_;
  auVar147._4_4_ = fVar66 * auVar9._4_4_;
  fVar143 = auVar84._8_4_;
  auVar147._8_4_ = fVar143 * auVar9._8_4_;
  fVar182 = auVar84._12_4_;
  auVar147._12_4_ = fVar182 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar147,auVar13,auVar70);
  auVar274 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar148._0_4_ = fVar64 * auVar9._0_4_;
  auVar148._4_4_ = fVar66 * auVar9._4_4_;
  auVar148._8_4_ = fVar143 * auVar9._8_4_;
  auVar148._12_4_ = fVar182 * auVar9._12_4_;
  auVar13 = vfmsub231ps_fma(auVar148,auVar13,auVar68);
  auVar10 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar212,auVar212,0xc9);
  auVar9 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar110 = auVar212._0_4_;
  auVar127._0_4_ = fVar110 * auVar9._0_4_;
  fVar124 = auVar212._4_4_;
  auVar127._4_4_ = fVar124 * auVar9._4_4_;
  fVar165 = auVar212._8_4_;
  auVar127._8_4_ = fVar165 * auVar9._8_4_;
  fVar166 = auVar212._12_4_;
  auVar127._12_4_ = fVar166 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar127,auVar13,auVar11);
  auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar168._0_4_ = fVar110 * auVar9._0_4_;
  auVar168._4_4_ = fVar124 * auVar9._4_4_;
  auVar168._8_4_ = fVar165 * auVar9._8_4_;
  auVar168._12_4_ = fVar166 * auVar9._12_4_;
  auVar13 = vfmsub231ps_fma(auVar168,auVar13,auVar12);
  auVar12 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vdpps_avx(auVar274,auVar274,0x7f);
  fVar160 = auVar13._0_4_;
  auVar70 = ZEXT416((uint)fVar160);
  auVar9 = vrsqrtss_avx(auVar70,auVar70);
  fVar142 = auVar9._0_4_;
  fVar142 = fVar142 * 1.5 + fVar160 * -0.5 * fVar142 * fVar142 * fVar142;
  auVar9 = vdpps_avx(auVar274,auVar10,0x7f);
  fVar141 = fVar142 * auVar274._0_4_;
  fVar159 = fVar142 * auVar274._4_4_;
  fVar161 = fVar142 * auVar274._8_4_;
  fVar163 = fVar142 * auVar274._12_4_;
  auVar233._0_4_ = auVar10._0_4_ * fVar160;
  auVar233._4_4_ = auVar10._4_4_ * fVar160;
  auVar233._8_4_ = auVar10._8_4_ * fVar160;
  auVar233._12_4_ = auVar10._12_4_ * fVar160;
  fVar160 = auVar9._0_4_;
  auVar190._0_4_ = fVar160 * auVar274._0_4_;
  auVar190._4_4_ = fVar160 * auVar274._4_4_;
  auVar190._8_4_ = fVar160 * auVar274._8_4_;
  auVar190._12_4_ = fVar160 * auVar274._12_4_;
  auVar274 = vsubps_avx(auVar233,auVar190);
  auVar9 = vrcpss_avx(auVar70,auVar70);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar162 = auVar9._0_4_ * auVar13._0_4_;
  auVar13 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar164 = auVar13._0_4_;
  auVar70 = ZEXT416((uint)fVar164);
  auVar9 = vrsqrtss_avx(auVar70,auVar70);
  fVar160 = auVar9._0_4_;
  auVar9 = vdpps_avx(auVar11,auVar12,0x7f);
  fVar160 = fVar160 * 1.5 + fVar164 * -0.5 * fVar160 * fVar160 * fVar160;
  fVar259 = fVar160 * auVar11._0_4_;
  fVar269 = fVar160 * auVar11._4_4_;
  fVar270 = fVar160 * auVar11._8_4_;
  fVar271 = fVar160 * auVar11._12_4_;
  auVar169._0_4_ = fVar164 * auVar12._0_4_;
  auVar169._4_4_ = fVar164 * auVar12._4_4_;
  auVar169._8_4_ = fVar164 * auVar12._8_4_;
  auVar169._12_4_ = fVar164 * auVar12._12_4_;
  fVar164 = auVar9._0_4_;
  auVar128._0_4_ = fVar164 * auVar11._0_4_;
  auVar128._4_4_ = fVar164 * auVar11._4_4_;
  auVar128._8_4_ = fVar164 * auVar11._8_4_;
  auVar128._12_4_ = fVar164 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar169,auVar128);
  auVar9 = vrcpss_avx(auVar70,auVar70);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar9,ZEXT416(0x40000000));
  fVar164 = auVar13._0_4_ * auVar9._0_4_;
  auVar13 = vshufps_avx(auVar69,auVar69,0xff);
  auVar208._0_4_ = auVar13._0_4_ * fVar141;
  auVar208._4_4_ = auVar13._4_4_ * fVar159;
  auVar208._8_4_ = auVar13._8_4_ * fVar161;
  auVar208._12_4_ = auVar13._12_4_ * fVar163;
  local_378 = vsubps_avx(auVar69,auVar208);
  auVar9 = vshufps_avx(auVar84,auVar84,0xff);
  auVar149._0_4_ = auVar9._0_4_ * fVar141 + auVar13._0_4_ * fVar142 * fVar162 * auVar274._0_4_;
  auVar149._4_4_ = auVar9._4_4_ * fVar159 + auVar13._4_4_ * fVar142 * fVar162 * auVar274._4_4_;
  auVar149._8_4_ = auVar9._8_4_ * fVar161 + auVar13._8_4_ * fVar142 * fVar162 * auVar274._8_4_;
  auVar149._12_4_ = auVar9._12_4_ * fVar163 + auVar13._12_4_ * fVar142 * fVar162 * auVar274._12_4_;
  auVar274 = vsubps_avx(auVar84,auVar149);
  local_388._0_4_ = auVar208._0_4_ + auVar69._0_4_;
  local_388._4_4_ = auVar208._4_4_ + auVar69._4_4_;
  fStack_380 = auVar208._8_4_ + auVar69._8_4_;
  fStack_37c = auVar208._12_4_ + auVar69._12_4_;
  auVar13 = vshufps_avx(auVar97,auVar97,0xff);
  auVar86._0_4_ = fVar259 * auVar13._0_4_;
  auVar86._4_4_ = fVar269 * auVar13._4_4_;
  auVar86._8_4_ = fVar270 * auVar13._8_4_;
  auVar86._12_4_ = fVar271 * auVar13._12_4_;
  local_398 = vsubps_avx(auVar97,auVar86);
  auVar9 = vshufps_avx(auVar212,auVar212,0xff);
  auVar72._0_4_ = fVar259 * auVar9._0_4_ + auVar13._0_4_ * fVar160 * auVar10._0_4_ * fVar164;
  auVar72._4_4_ = fVar269 * auVar9._4_4_ + auVar13._4_4_ * fVar160 * auVar10._4_4_ * fVar164;
  auVar72._8_4_ = fVar270 * auVar9._8_4_ + auVar13._8_4_ * fVar160 * auVar10._8_4_ * fVar164;
  auVar72._12_4_ = fVar271 * auVar9._12_4_ + auVar13._12_4_ * fVar160 * auVar10._12_4_ * fVar164;
  auVar13 = vsubps_avx(auVar212,auVar72);
  local_3e8 = auVar97._0_4_ + auVar86._0_4_;
  fStack_3e4 = auVar97._4_4_ + auVar86._4_4_;
  fStack_3e0 = auVar97._8_4_ + auVar86._8_4_;
  fStack_3dc = auVar97._12_4_ + auVar86._12_4_;
  local_3a8._0_4_ = local_378._0_4_ + auVar274._0_4_ * 0.33333334;
  local_3a8._4_4_ = local_378._4_4_ + auVar274._4_4_ * 0.33333334;
  local_3a8._8_4_ = local_378._8_4_ + auVar274._8_4_ * 0.33333334;
  local_3a8._12_4_ = local_378._12_4_ + auVar274._12_4_ * 0.33333334;
  auVar73._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar73._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar73._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar73._12_4_ = auVar13._12_4_ * 0.33333334;
  local_3b8 = vsubps_avx(local_398,auVar73);
  aVar2 = (ray->org).field_0;
  auVar274 = vsubps_avx(local_378,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar274,auVar274,0x55);
  auVar9 = vshufps_avx(auVar274,auVar274,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar142 = (pre->ray_space).vz.field_0.m128[0];
  fVar160 = (pre->ray_space).vz.field_0.m128[1];
  fVar162 = (pre->ray_space).vz.field_0.m128[2];
  fVar164 = (pre->ray_space).vz.field_0.m128[3];
  auVar74._0_4_ = fVar142 * auVar9._0_4_;
  auVar74._4_4_ = fVar160 * auVar9._4_4_;
  auVar74._8_4_ = fVar162 * auVar9._8_4_;
  auVar74._12_4_ = fVar164 * auVar9._12_4_;
  auVar84 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar3,auVar13);
  auVar10 = vsubps_avx(local_3a8,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar10,auVar10,0x55);
  auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar75._0_4_ = fVar142 * auVar9._0_4_;
  auVar75._4_4_ = fVar160 * auVar9._4_4_;
  auVar75._8_4_ = fVar162 * auVar9._8_4_;
  auVar75._12_4_ = fVar164 * auVar9._12_4_;
  auVar68 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar3,auVar13);
  auVar9 = vsubps_avx(local_3b8,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar76._0_4_ = fVar142 * auVar13._0_4_;
  auVar76._4_4_ = fVar160 * auVar13._4_4_;
  auVar76._8_4_ = fVar162 * auVar13._8_4_;
  auVar76._12_4_ = fVar164 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar9,auVar9,0x55);
  auVar212 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar3,auVar13);
  auVar11 = vsubps_avx(local_398,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar77._0_4_ = fVar142 * auVar13._0_4_;
  auVar77._4_4_ = fVar160 * auVar13._4_4_;
  auVar77._8_4_ = fVar162 * auVar13._8_4_;
  auVar77._12_4_ = fVar164 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar11,auVar11,0x55);
  auVar85 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar3,auVar13);
  auVar12 = vsubps_avx(_local_388,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar12,auVar12,0xaa);
  auVar150._0_4_ = fVar142 * auVar13._0_4_;
  auVar150._4_4_ = fVar160 * auVar13._4_4_;
  auVar150._8_4_ = fVar162 * auVar13._8_4_;
  auVar150._12_4_ = fVar164 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar12,auVar12,0x55);
  auVar126 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar3,auVar13);
  local_3c8._0_4_ = (fVar64 + auVar149._0_4_) * 0.33333334 + (float)local_388._0_4_;
  local_3c8._4_4_ = (fVar66 + auVar149._4_4_) * 0.33333334 + (float)local_388._4_4_;
  fStack_3c0 = (fVar143 + auVar149._8_4_) * 0.33333334 + fStack_380;
  fStack_3bc = (fVar182 + auVar149._12_4_) * 0.33333334 + fStack_37c;
  auVar70 = vsubps_avx(_local_3c8,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar70,auVar70,0xaa);
  auVar245._0_4_ = fVar142 * auVar13._0_4_;
  auVar245._4_4_ = fVar160 * auVar13._4_4_;
  auVar245._8_4_ = fVar162 * auVar13._8_4_;
  auVar245._12_4_ = fVar164 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar70,auVar70,0x55);
  auVar67 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar3,auVar13);
  auVar234._0_4_ = (fVar110 + auVar72._0_4_) * 0.33333334;
  auVar234._4_4_ = (fVar124 + auVar72._4_4_) * 0.33333334;
  auVar234._8_4_ = (fVar165 + auVar72._8_4_) * 0.33333334;
  auVar234._12_4_ = (fVar166 + auVar72._12_4_) * 0.33333334;
  auVar48._4_4_ = fStack_3e4;
  auVar48._0_4_ = local_3e8;
  auVar48._8_4_ = fStack_3e0;
  auVar48._12_4_ = fStack_3dc;
  _local_3d8 = vsubps_avx(auVar48,auVar234);
  auVar69 = vsubps_avx(_local_3d8,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar235._0_4_ = fVar142 * auVar13._0_4_;
  auVar235._4_4_ = fVar160 * auVar13._4_4_;
  auVar235._8_4_ = fVar162 * auVar13._8_4_;
  auVar235._12_4_ = fVar164 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar69,auVar69,0x55);
  auVar131 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar3,auVar13);
  auVar97 = vsubps_avx(auVar48,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar97,auVar97,0xaa);
  auVar191._0_4_ = fVar142 * auVar13._0_4_;
  auVar191._4_4_ = fVar160 * auVar13._4_4_;
  auVar191._8_4_ = fVar162 * auVar13._8_4_;
  auVar191._12_4_ = fVar164 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar97,auVar97,0x55);
  auVar13 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar3,auVar13);
  local_448._0_4_ = auVar274._0_4_;
  auVar170._4_4_ = local_448._0_4_;
  auVar170._0_4_ = local_448._0_4_;
  auVar170._8_4_ = local_448._0_4_;
  auVar170._12_4_ = local_448._0_4_;
  aVar3 = (pre->ray_space).vx.field_0;
  auVar84 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar3,auVar170);
  local_548 = auVar10._0_4_;
  auVar171._4_4_ = local_548;
  auVar171._0_4_ = local_548;
  auVar171._8_4_ = local_548;
  auVar171._12_4_ = local_548;
  auVar10 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar3,auVar171);
  uVar65 = auVar9._0_4_;
  auVar172._4_4_ = uVar65;
  auVar172._0_4_ = uVar65;
  auVar172._8_4_ = uVar65;
  auVar172._12_4_ = uVar65;
  auVar68 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar3,auVar172);
  uVar65 = auVar11._0_4_;
  auVar173._4_4_ = uVar65;
  auVar173._0_4_ = uVar65;
  auVar173._8_4_ = uVar65;
  auVar173._12_4_ = uVar65;
  auVar11 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar3,auVar173);
  uVar65 = auVar12._0_4_;
  auVar174._4_4_ = uVar65;
  auVar174._0_4_ = uVar65;
  auVar174._8_4_ = uVar65;
  auVar174._12_4_ = uVar65;
  auVar12 = vfmadd231ps_fma(auVar126,(undefined1  [16])aVar3,auVar174);
  uVar65 = auVar70._0_4_;
  auVar175._4_4_ = uVar65;
  auVar175._0_4_ = uVar65;
  auVar175._8_4_ = uVar65;
  auVar175._12_4_ = uVar65;
  auVar70 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar3,auVar175);
  uVar65 = auVar69._0_4_;
  auVar78._4_4_ = uVar65;
  auVar78._0_4_ = uVar65;
  auVar78._8_4_ = uVar65;
  auVar78._12_4_ = uVar65;
  auVar69 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar3,auVar78);
  uVar65 = auVar97._0_4_;
  auVar79._4_4_ = uVar65;
  auVar79._0_4_ = uVar65;
  auVar79._8_4_ = uVar65;
  auVar79._12_4_ = uVar65;
  auVar97 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar79);
  local_498 = vmovlhps_avx(auVar84,auVar12);
  local_4a8 = vmovlhps_avx(auVar10,auVar70);
  local_348 = vmovlhps_avx(auVar68,auVar69);
  _local_258 = vmovlhps_avx(auVar11,auVar97);
  auVar278 = ZEXT1664(_local_258);
  auVar13 = vminps_avx(local_498,local_4a8);
  auVar9 = vminps_avx(local_348,_local_258);
  auVar274 = vminps_avx(auVar13,auVar9);
  auVar13 = vmaxps_avx(local_498,local_4a8);
  auVar9 = vmaxps_avx(local_348,_local_258);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  auVar9 = vshufpd_avx(auVar274,auVar274,3);
  auVar274 = vminps_avx(auVar274,auVar9);
  auVar9 = vshufpd_avx(auVar13,auVar13,3);
  auVar9 = vmaxps_avx(auVar13,auVar9);
  auVar13 = vandps_avx(local_358,auVar274);
  auVar9 = vandps_avx(local_358,auVar9);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  auVar9 = vmovshdup_avx(auVar13);
  auVar13 = vmaxss_avx(auVar9,auVar13);
  local_198 = auVar13._0_4_ * 9.536743e-07;
  auVar281._8_8_ = auVar84._0_8_;
  auVar281._0_8_ = auVar84._0_8_;
  auVar209._8_8_ = auVar10._0_8_;
  auVar209._0_8_ = auVar10._0_8_;
  auVar87._8_8_ = auVar68._0_8_;
  auVar87._0_8_ = auVar68._0_8_;
  auVar98._8_8_ = auVar11._0_8_;
  auVar98._0_8_ = auVar11._0_8_;
  local_448 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = (uint)local_198 ^ local_368;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a8 = local_1b8;
  uStack_1a4 = local_1b8;
  uStack_1a0 = local_1b8;
  uStack_19c = local_1b8;
  uVar62 = 0;
  uVar56 = 0;
  local_228 = vsubps_avx(local_4a8,local_498);
  local_238 = vsubps_avx(local_348,local_4a8);
  local_248 = vsubps_avx(_local_258,local_348);
  local_288 = vsubps_avx(_local_388,local_378);
  local_298 = vsubps_avx(_local_3c8,local_3a8);
  local_2a8 = vsubps_avx(_local_3d8,local_3b8);
  auVar49._4_4_ = fStack_3e4;
  auVar49._0_4_ = local_3e8;
  auVar49._8_4_ = fStack_3e0;
  auVar49._12_4_ = fStack_3dc;
  _local_2b8 = vsubps_avx(auVar49,local_398);
  local_4e8 = ZEXT816(0x3f80000000000000);
  local_268 = local_4e8;
  do {
    auVar13 = vshufps_avx(local_4e8,local_4e8,0x50);
    auVar114._8_4_ = 0x3f800000;
    auVar114._0_8_ = &DAT_3f8000003f800000;
    auVar114._12_4_ = 0x3f800000;
    auVar121._16_4_ = 0x3f800000;
    auVar121._0_16_ = auVar114;
    auVar121._20_4_ = 0x3f800000;
    auVar121._24_4_ = 0x3f800000;
    auVar121._28_4_ = 0x3f800000;
    auVar9 = vsubps_avx(auVar114,auVar13);
    fVar142 = auVar13._0_4_;
    fVar110 = auVar12._0_4_;
    auVar80._0_4_ = fVar110 * fVar142;
    fVar160 = auVar13._4_4_;
    fVar124 = auVar12._4_4_;
    auVar80._4_4_ = fVar124 * fVar160;
    fVar162 = auVar13._8_4_;
    auVar80._8_4_ = fVar110 * fVar162;
    fVar164 = auVar13._12_4_;
    auVar80._12_4_ = fVar124 * fVar164;
    fVar187 = auVar70._0_4_;
    auVar151._0_4_ = fVar187 * fVar142;
    fVar204 = auVar70._4_4_;
    auVar151._4_4_ = fVar204 * fVar160;
    auVar151._8_4_ = fVar187 * fVar162;
    auVar151._12_4_ = fVar204 * fVar164;
    fVar231 = auVar69._0_4_;
    auVar192._0_4_ = fVar231 * fVar142;
    fVar242 = auVar69._4_4_;
    auVar192._4_4_ = fVar242 * fVar160;
    auVar192._8_4_ = fVar231 * fVar162;
    auVar192._12_4_ = fVar242 * fVar164;
    fVar221 = auVar97._0_4_;
    auVar236._0_4_ = fVar221 * fVar142;
    fVar230 = auVar97._4_4_;
    auVar236._4_4_ = fVar230 * fVar160;
    auVar236._8_4_ = fVar221 * fVar162;
    auVar236._12_4_ = fVar230 * fVar164;
    auVar11 = vfmadd231ps_fma(auVar80,auVar9,auVar281);
    auVar84 = vfmadd231ps_fma(auVar151,auVar9,auVar209);
    auVar68 = vfmadd231ps_fma(auVar192,auVar9,auVar87);
    auVar212 = vfmadd231ps_fma(auVar236,auVar98,auVar9);
    auVar13 = vmovshdup_avx(local_268);
    fVar142 = local_268._0_4_;
    fVar64 = (auVar13._0_4_ - fVar142) * 0.04761905;
    auVar220._4_4_ = fVar142;
    auVar220._0_4_ = fVar142;
    auVar220._8_4_ = fVar142;
    auVar220._12_4_ = fVar142;
    auVar220._16_4_ = fVar142;
    auVar220._20_4_ = fVar142;
    auVar220._24_4_ = fVar142;
    auVar220._28_4_ = fVar142;
    auVar107._0_8_ = auVar13._0_8_;
    auVar107._8_8_ = auVar107._0_8_;
    auVar107._16_8_ = auVar107._0_8_;
    auVar107._24_8_ = auVar107._0_8_;
    auVar83 = vsubps_avx(auVar107,auVar220);
    uVar65 = auVar11._0_4_;
    auVar285._4_4_ = uVar65;
    auVar285._0_4_ = uVar65;
    auVar285._8_4_ = uVar65;
    auVar285._12_4_ = uVar65;
    auVar285._16_4_ = uVar65;
    auVar285._20_4_ = uVar65;
    auVar285._24_4_ = uVar65;
    auVar285._28_4_ = uVar65;
    auVar13 = vmovshdup_avx(auVar11);
    uVar167 = auVar13._0_8_;
    auVar267._8_8_ = uVar167;
    auVar267._0_8_ = uVar167;
    auVar267._16_8_ = uVar167;
    auVar267._24_8_ = uVar167;
    fVar66 = auVar84._0_4_;
    auVar95._4_4_ = fVar66;
    auVar95._0_4_ = fVar66;
    auVar95._8_4_ = fVar66;
    auVar95._12_4_ = fVar66;
    auVar95._16_4_ = fVar66;
    auVar95._20_4_ = fVar66;
    auVar95._24_4_ = fVar66;
    auVar95._28_4_ = fVar66;
    auVar9 = vmovshdup_avx(auVar84);
    auVar179._0_8_ = auVar9._0_8_;
    auVar179._8_8_ = auVar179._0_8_;
    auVar179._16_8_ = auVar179._0_8_;
    auVar179._24_8_ = auVar179._0_8_;
    fVar165 = auVar68._0_4_;
    auVar252._4_4_ = fVar165;
    auVar252._0_4_ = fVar165;
    auVar252._8_4_ = fVar165;
    auVar252._12_4_ = fVar165;
    auVar252._16_4_ = fVar165;
    auVar252._20_4_ = fVar165;
    auVar252._24_4_ = fVar165;
    auVar252._28_4_ = fVar165;
    auVar274 = vmovshdup_avx(auVar68);
    auVar229._0_8_ = auVar274._0_8_;
    auVar229._8_8_ = auVar229._0_8_;
    auVar229._16_8_ = auVar229._0_8_;
    auVar229._24_8_ = auVar229._0_8_;
    local_488 = auVar212._0_4_;
    auVar10 = vmovshdup_avx(auVar212);
    auVar85 = vfmadd132ps_fma(auVar83,auVar220,_DAT_02020f20);
    auVar83 = vsubps_avx(auVar121,ZEXT1632(auVar85));
    fVar142 = auVar85._0_4_;
    auVar279._0_4_ = fVar66 * fVar142;
    fVar160 = auVar85._4_4_;
    auVar279._4_4_ = fVar66 * fVar160;
    fVar162 = auVar85._8_4_;
    auVar279._8_4_ = fVar66 * fVar162;
    fVar164 = auVar85._12_4_;
    auVar279._12_4_ = fVar66 * fVar164;
    auVar279._16_4_ = fVar66 * 0.0;
    auVar279._20_4_ = fVar66 * 0.0;
    auVar279._28_36_ = auVar278._28_36_;
    auVar279._24_4_ = fVar66 * 0.0;
    auVar85 = vfmadd231ps_fma(auVar279._0_32_,auVar83,auVar285);
    fVar143 = auVar9._0_4_;
    fVar182 = auVar9._4_4_;
    auVar14._4_4_ = fVar182 * fVar160;
    auVar14._0_4_ = fVar143 * fVar142;
    auVar14._8_4_ = fVar143 * fVar162;
    auVar14._12_4_ = fVar182 * fVar164;
    auVar14._16_4_ = fVar143 * 0.0;
    auVar14._20_4_ = fVar182 * 0.0;
    auVar14._24_4_ = fVar143 * 0.0;
    auVar14._28_4_ = local_488;
    auVar126 = vfmadd231ps_fma(auVar14,auVar83,auVar267);
    auVar15._4_4_ = fVar165 * fVar160;
    auVar15._0_4_ = fVar165 * fVar142;
    auVar15._8_4_ = fVar165 * fVar162;
    auVar15._12_4_ = fVar165 * fVar164;
    auVar15._16_4_ = fVar165 * 0.0;
    auVar15._20_4_ = fVar165 * 0.0;
    auVar15._24_4_ = fVar165 * 0.0;
    auVar15._28_4_ = auVar13._4_4_;
    auVar67 = vfmadd231ps_fma(auVar15,auVar83,auVar95);
    fVar143 = auVar274._0_4_;
    fVar182 = auVar274._4_4_;
    auVar16._4_4_ = fVar182 * fVar160;
    auVar16._0_4_ = fVar143 * fVar142;
    auVar16._8_4_ = fVar143 * fVar162;
    auVar16._12_4_ = fVar182 * fVar164;
    auVar16._16_4_ = fVar143 * 0.0;
    auVar16._20_4_ = fVar182 * 0.0;
    auVar16._24_4_ = fVar143 * 0.0;
    auVar16._28_4_ = uVar65;
    auVar131 = vfmadd231ps_fma(auVar16,auVar83,auVar179);
    auVar13 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar180._0_8_ = auVar13._0_8_;
    auVar180._8_8_ = auVar180._0_8_;
    auVar180._16_8_ = auVar180._0_8_;
    auVar180._24_8_ = auVar180._0_8_;
    auVar9 = vshufps_avx(auVar11,auVar11,0xff);
    uStack_400 = auVar9._0_8_;
    local_408 = (undefined1  [8])uStack_400;
    uStack_3f8 = uStack_400;
    uStack_3f0 = uStack_400;
    auVar17._4_4_ = fVar160 * local_488;
    auVar17._0_4_ = fVar142 * local_488;
    auVar17._8_4_ = fVar162 * local_488;
    auVar17._12_4_ = fVar164 * local_488;
    auVar17._16_4_ = local_488 * 0.0;
    auVar17._20_4_ = local_488 * 0.0;
    auVar17._24_4_ = local_488 * 0.0;
    auVar17._28_4_ = 0x3f800000;
    auVar125 = vfmadd231ps_fma(auVar17,auVar83,auVar252);
    auVar274 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar139._0_8_ = auVar274._0_8_;
    auVar139._8_8_ = auVar139._0_8_;
    auVar139._16_8_ = auVar139._0_8_;
    auVar139._24_8_ = auVar139._0_8_;
    auVar11 = vshufps_avx(auVar84,auVar84,0xff);
    auVar158._0_8_ = auVar11._0_8_;
    auVar158._8_8_ = auVar158._0_8_;
    auVar158._16_8_ = auVar158._0_8_;
    auVar158._24_8_ = auVar158._0_8_;
    fVar143 = auVar10._0_4_;
    fVar182 = auVar10._4_4_;
    auVar258._4_4_ = fVar182 * fVar160;
    auVar258._0_4_ = fVar143 * fVar142;
    auVar258._8_4_ = fVar143 * fVar162;
    auVar258._12_4_ = fVar182 * fVar164;
    auVar258._16_4_ = fVar143 * 0.0;
    auVar258._20_4_ = fVar182 * 0.0;
    auVar258._24_4_ = fVar143 * 0.0;
    auVar258._28_4_ = fVar165;
    auVar144 = vfmadd231ps_fma(auVar258,auVar83,auVar229);
    auVar19._28_4_ = fVar66;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar67._12_4_ * fVar164,
                            CONCAT48(auVar67._8_4_ * fVar162,
                                     CONCAT44(auVar67._4_4_ * fVar160,auVar67._0_4_ * fVar142))));
    auVar85 = vfmadd231ps_fma(auVar19,auVar83,ZEXT1632(auVar85));
    auVar20._28_4_ = auVar9._4_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar131._12_4_ * fVar164,
                            CONCAT48(auVar131._8_4_ * fVar162,
                                     CONCAT44(auVar131._4_4_ * fVar160,auVar131._0_4_ * fVar142))));
    auVar126 = vfmadd231ps_fma(auVar20,auVar83,ZEXT1632(auVar126));
    auVar9 = vshufps_avx(auVar68,auVar68,0xaa);
    uVar167 = auVar9._0_8_;
    auVar257._8_8_ = uVar167;
    auVar257._0_8_ = uVar167;
    auVar257._16_8_ = uVar167;
    auVar257._24_8_ = uVar167;
    auVar10 = vshufps_avx(auVar68,auVar68,0xff);
    uVar167 = auVar10._0_8_;
    auVar276._8_8_ = uVar167;
    auVar276._0_8_ = uVar167;
    auVar276._16_8_ = uVar167;
    auVar276._24_8_ = uVar167;
    auVar67 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar125._12_4_,
                                                 CONCAT48(fVar162 * auVar125._8_4_,
                                                          CONCAT44(fVar160 * auVar125._4_4_,
                                                                   fVar142 * auVar125._0_4_)))),
                              auVar83,ZEXT1632(auVar67));
    auVar84 = vshufps_avx(auVar212,auVar212,0xaa);
    auVar68 = vshufps_avx(auVar212,auVar212,0xff);
    local_488 = auVar68._0_4_;
    fStack_484 = auVar68._4_4_;
    auVar21._28_4_ = fStack_484;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(auVar144._12_4_ * fVar164,
                            CONCAT48(auVar144._8_4_ * fVar162,
                                     CONCAT44(auVar144._4_4_ * fVar160,auVar144._0_4_ * fVar142))));
    auVar68 = vfmadd231ps_fma(auVar21,auVar83,ZEXT1632(auVar131));
    auVar212 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar67._12_4_,
                                                  CONCAT48(fVar162 * auVar67._8_4_,
                                                           CONCAT44(fVar160 * auVar67._4_4_,
                                                                    fVar142 * auVar67._0_4_)))),
                               auVar83,ZEXT1632(auVar85));
    auVar14 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar85));
    auVar85 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar68._12_4_,
                                                 CONCAT48(fVar162 * auVar68._8_4_,
                                                          CONCAT44(fVar160 * auVar68._4_4_,
                                                                   fVar142 * auVar68._0_4_)))),
                              auVar83,ZEXT1632(auVar126));
    auVar15 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar126));
    fVar159 = fVar64 * auVar14._0_4_ * 3.0;
    fVar163 = fVar64 * auVar14._4_4_ * 3.0;
    auVar22._4_4_ = fVar163;
    auVar22._0_4_ = fVar159;
    fVar269 = fVar64 * auVar14._8_4_ * 3.0;
    auVar22._8_4_ = fVar269;
    fVar271 = fVar64 * auVar14._12_4_ * 3.0;
    auVar22._12_4_ = fVar271;
    fStack_478 = fVar64 * auVar14._16_4_ * 3.0;
    auVar22._16_4_ = fStack_478;
    fStack_474 = fVar64 * auVar14._20_4_ * 3.0;
    auVar22._20_4_ = fStack_474;
    fStack_470 = fVar64 * auVar14._24_4_ * 3.0;
    auVar22._24_4_ = fStack_470;
    auVar22._28_4_ = 0x40400000;
    local_428._0_4_ = fVar64 * auVar15._0_4_ * 3.0;
    local_428._4_4_ = fVar64 * auVar15._4_4_ * 3.0;
    fStack_420 = fVar64 * auVar15._8_4_ * 3.0;
    fStack_41c = fVar64 * auVar15._12_4_ * 3.0;
    fStack_418 = fVar64 * auVar15._16_4_ * 3.0;
    fStack_414 = fVar64 * auVar15._20_4_ * 3.0;
    fStack_410 = fVar64 * auVar15._24_4_ * 3.0;
    fStack_40c = auVar15._28_4_;
    fVar66 = auVar274._0_4_;
    fVar143 = auVar274._4_4_;
    auVar23._4_4_ = fVar143 * fVar160;
    auVar23._0_4_ = fVar66 * fVar142;
    auVar23._8_4_ = fVar66 * fVar162;
    auVar23._12_4_ = fVar143 * fVar164;
    auVar23._16_4_ = fVar66 * 0.0;
    auVar23._20_4_ = fVar143 * 0.0;
    auVar23._24_4_ = fVar66 * 0.0;
    auVar23._28_4_ = auVar14._28_4_;
    auVar274 = vfmadd231ps_fma(auVar23,auVar83,auVar180);
    fVar66 = auVar11._0_4_;
    fVar182 = auVar11._4_4_;
    auVar24._4_4_ = fVar182 * fVar160;
    auVar24._0_4_ = fVar66 * fVar142;
    auVar24._8_4_ = fVar66 * fVar162;
    auVar24._12_4_ = fVar182 * fVar164;
    auVar24._16_4_ = fVar66 * 0.0;
    auVar24._20_4_ = fVar182 * 0.0;
    auVar24._24_4_ = fVar66 * 0.0;
    auVar24._28_4_ = auVar13._4_4_;
    auVar13 = vfmadd231ps_fma(auVar24,auVar83,_local_408);
    fVar66 = auVar9._0_4_;
    fVar182 = auVar9._4_4_;
    auVar25._4_4_ = fVar182 * fVar160;
    auVar25._0_4_ = fVar66 * fVar142;
    auVar25._8_4_ = fVar66 * fVar162;
    auVar25._12_4_ = fVar182 * fVar164;
    auVar25._16_4_ = fVar66 * 0.0;
    auVar25._20_4_ = fVar182 * 0.0;
    auVar25._24_4_ = fVar66 * 0.0;
    auVar25._28_4_ = fVar64;
    auVar9 = vfmadd231ps_fma(auVar25,auVar83,auVar139);
    fVar66 = auVar10._0_4_;
    fVar165 = auVar10._4_4_;
    auVar26._4_4_ = fVar165 * fVar160;
    auVar26._0_4_ = fVar66 * fVar142;
    auVar26._8_4_ = fVar66 * fVar162;
    auVar26._12_4_ = fVar165 * fVar164;
    auVar26._16_4_ = fVar66 * 0.0;
    auVar26._20_4_ = fVar165 * 0.0;
    auVar26._24_4_ = fVar66 * 0.0;
    auVar26._28_4_ = fVar143;
    auVar10 = vfmadd231ps_fma(auVar26,auVar83,auVar158);
    local_218 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar212));
    fVar66 = auVar84._0_4_;
    fVar143 = auVar84._4_4_;
    auVar27._4_4_ = fVar143 * fVar160;
    auVar27._0_4_ = fVar66 * fVar142;
    auVar27._8_4_ = fVar66 * fVar162;
    auVar27._12_4_ = fVar143 * fVar164;
    auVar27._16_4_ = fVar66 * 0.0;
    auVar27._20_4_ = fVar143 * 0.0;
    auVar27._24_4_ = fVar66 * 0.0;
    auVar27._28_4_ = local_218._28_4_;
    auVar11 = vfmadd231ps_fma(auVar27,auVar83,auVar257);
    _local_408 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar85));
    auVar28._4_4_ = fVar160 * fStack_484;
    auVar28._0_4_ = fVar142 * local_488;
    auVar28._8_4_ = fVar162 * local_488;
    auVar28._12_4_ = fVar164 * fStack_484;
    auVar28._16_4_ = local_488 * 0.0;
    auVar28._20_4_ = fStack_484 * 0.0;
    auVar28._24_4_ = local_488 * 0.0;
    auVar28._28_4_ = fVar182;
    auVar84 = vfmadd231ps_fma(auVar28,auVar83,auVar276);
    auVar29._28_4_ = fVar143;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar164 * auVar9._12_4_,
                            CONCAT48(fVar162 * auVar9._8_4_,
                                     CONCAT44(fVar160 * auVar9._4_4_,fVar142 * auVar9._0_4_))));
    auVar274 = vfmadd231ps_fma(auVar29,auVar83,ZEXT1632(auVar274));
    auVar13 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar10._12_4_,
                                                 CONCAT48(fVar162 * auVar10._8_4_,
                                                          CONCAT44(fVar160 * auVar10._4_4_,
                                                                   fVar142 * auVar10._0_4_)))),
                              auVar83,ZEXT1632(auVar13));
    fVar159 = auVar212._0_4_ + fVar159;
    fVar163 = auVar212._4_4_ + fVar163;
    fVar269 = auVar212._8_4_ + fVar269;
    fVar271 = auVar212._12_4_ + fVar271;
    fStack_478 = fStack_478 + 0.0;
    fStack_474 = fStack_474 + 0.0;
    fStack_470 = fStack_470 + 0.0;
    uStack_46c = 0x40400000;
    auVar30._28_4_ = 0x40400000;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar84._12_4_ * fVar164,
                            CONCAT48(auVar84._8_4_ * fVar162,
                                     CONCAT44(auVar84._4_4_ * fVar160,auVar84._0_4_ * fVar142))));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar11._12_4_,
                                                CONCAT48(fVar162 * auVar11._8_4_,
                                                         CONCAT44(fVar160 * auVar11._4_4_,
                                                                  fVar142 * auVar11._0_4_)))),
                             auVar83,ZEXT1632(auVar9));
    auVar10 = vfmadd231ps_fma(auVar30,auVar83,ZEXT1632(auVar10));
    auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar9._12_4_,
                                                 CONCAT48(fVar162 * auVar9._8_4_,
                                                          CONCAT44(fVar160 * auVar9._4_4_,
                                                                   fVar142 * auVar9._0_4_)))),
                              auVar83,ZEXT1632(auVar274));
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar10._12_4_,
                                                 CONCAT48(fVar162 * auVar10._8_4_,
                                                          CONCAT44(fVar160 * auVar10._4_4_,
                                                                   fVar142 * auVar10._0_4_)))),
                              ZEXT1632(auVar13),auVar83);
    auVar83 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar274));
    auVar14 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar13));
    fVar142 = fVar64 * auVar83._0_4_ * 3.0;
    fVar160 = fVar64 * auVar83._4_4_ * 3.0;
    auVar31._4_4_ = fVar160;
    auVar31._0_4_ = fVar142;
    fVar162 = fVar64 * auVar83._8_4_ * 3.0;
    auVar31._8_4_ = fVar162;
    fVar164 = fVar64 * auVar83._12_4_ * 3.0;
    auVar31._12_4_ = fVar164;
    fVar165 = fVar64 * auVar83._16_4_ * 3.0;
    auVar31._16_4_ = fVar165;
    fVar166 = fVar64 * auVar83._20_4_ * 3.0;
    auVar31._20_4_ = fVar166;
    fVar141 = fVar64 * auVar83._24_4_ * 3.0;
    auVar31._24_4_ = fVar141;
    auVar31._28_4_ = 0x40400000;
    auVar203._0_4_ = fVar64 * auVar14._0_4_ * 3.0;
    auVar203._4_4_ = fVar64 * auVar14._4_4_ * 3.0;
    auVar203._8_4_ = fVar64 * auVar14._8_4_ * 3.0;
    auVar203._12_4_ = fVar64 * auVar14._12_4_ * 3.0;
    auVar203._16_4_ = fVar64 * auVar14._16_4_ * 3.0;
    auVar203._20_4_ = fVar64 * auVar14._20_4_ * 3.0;
    auVar203._24_4_ = fVar64 * auVar14._24_4_ * 3.0;
    auVar203._28_4_ = 0;
    local_468 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar11));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar84));
    auVar83 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar212));
    auVar14 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar85));
    auVar16 = vsubps_avx(local_468,local_218);
    fVar161 = auVar83._0_4_ + auVar16._0_4_;
    fVar259 = auVar83._4_4_ + auVar16._4_4_;
    fVar270 = auVar83._8_4_ + auVar16._8_4_;
    fVar183 = auVar83._12_4_ + auVar16._12_4_;
    fVar184 = auVar83._16_4_ + auVar16._16_4_;
    fVar185 = auVar83._20_4_ + auVar16._20_4_;
    fVar186 = auVar83._24_4_ + auVar16._24_4_;
    auVar17 = vsubps_avx(local_78,_local_408);
    auVar268._0_4_ = auVar14._0_4_ + auVar17._0_4_;
    auVar268._4_4_ = auVar14._4_4_ + auVar17._4_4_;
    auVar268._8_4_ = auVar14._8_4_ + auVar17._8_4_;
    auVar268._12_4_ = auVar14._12_4_ + auVar17._12_4_;
    auVar268._16_4_ = auVar14._16_4_ + auVar17._16_4_;
    auVar268._20_4_ = auVar14._20_4_ + auVar17._20_4_;
    auVar268._24_4_ = auVar14._24_4_ + auVar17._24_4_;
    auVar268._28_4_ = auVar14._28_4_ + auVar17._28_4_;
    fVar64 = auVar85._0_4_;
    local_158 = fVar64 + (float)local_428._0_4_;
    fVar66 = auVar85._4_4_;
    fStack_154 = fVar66 + (float)local_428._4_4_;
    fVar143 = auVar85._8_4_;
    fStack_150 = fVar143 + fStack_420;
    fVar182 = auVar85._12_4_;
    fStack_14c = fVar182 + fStack_41c;
    fStack_148 = fStack_418 + 0.0;
    fStack_144 = fStack_414 + 0.0;
    fStack_140 = fStack_410 + 0.0;
    fStack_13c = auVar15._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar212);
    auVar14 = vsubps_avx(local_98,auVar22);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_b8 = ZEXT1632(auVar85);
    auVar14 = vsubps_avx(local_b8,_local_428);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_f8._0_4_ = auVar11._0_4_ + fVar142;
    local_f8._4_4_ = auVar11._4_4_ + fVar160;
    local_f8._8_4_ = auVar11._8_4_ + fVar162;
    local_f8._12_4_ = auVar11._12_4_ + fVar164;
    local_f8._16_4_ = fVar165 + 0.0;
    local_f8._20_4_ = fVar166 + 0.0;
    local_f8._24_4_ = fVar141 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar258 = ZEXT1632(auVar11);
    auVar14 = vsubps_avx(auVar258,auVar31);
    _local_428 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    fVar142 = auVar84._0_4_;
    local_138._0_4_ = fVar142 + auVar203._0_4_;
    fVar160 = auVar84._4_4_;
    local_138._4_4_ = fVar160 + auVar203._4_4_;
    fVar162 = auVar84._8_4_;
    local_138._8_4_ = fVar162 + auVar203._8_4_;
    fVar164 = auVar84._12_4_;
    local_138._12_4_ = fVar164 + auVar203._12_4_;
    local_138._16_4_ = auVar203._16_4_ + 0.0;
    local_138._20_4_ = auVar203._20_4_ + 0.0;
    local_138._24_4_ = auVar203._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar14 = vsubps_avx(ZEXT1632(auVar84),auVar203);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    auVar32._4_4_ = fVar66 * fVar259;
    auVar32._0_4_ = fVar64 * fVar161;
    auVar32._8_4_ = fVar143 * fVar270;
    auVar32._12_4_ = fVar182 * fVar183;
    auVar32._16_4_ = fVar184 * 0.0;
    auVar32._20_4_ = fVar185 * 0.0;
    auVar32._24_4_ = fVar186 * 0.0;
    auVar32._28_4_ = auVar14._28_4_;
    auVar13 = vfnmadd231ps_fma(auVar32,local_98,auVar268);
    auVar33._4_4_ = fStack_154 * fVar259;
    auVar33._0_4_ = local_158 * fVar161;
    auVar33._8_4_ = fStack_150 * fVar270;
    auVar33._12_4_ = fStack_14c * fVar183;
    auVar33._16_4_ = fStack_148 * fVar184;
    auVar33._20_4_ = fStack_144 * fVar185;
    auVar33._24_4_ = fStack_140 * fVar186;
    auVar33._28_4_ = local_428._28_4_;
    auVar46._4_4_ = fVar163;
    auVar46._0_4_ = fVar159;
    auVar46._8_4_ = fVar269;
    auVar46._12_4_ = fVar271;
    auVar46._16_4_ = fStack_478;
    auVar46._20_4_ = fStack_474;
    auVar46._24_4_ = fStack_470;
    auVar46._28_4_ = 0x40400000;
    auVar9 = vfnmadd231ps_fma(auVar33,auVar268,auVar46);
    auVar34._4_4_ = local_178._4_4_ * fVar259;
    auVar34._0_4_ = local_178._0_4_ * fVar161;
    auVar34._8_4_ = local_178._8_4_ * fVar270;
    auVar34._12_4_ = local_178._12_4_ * fVar183;
    auVar34._16_4_ = local_178._16_4_ * fVar184;
    auVar34._20_4_ = local_178._20_4_ * fVar185;
    auVar34._24_4_ = local_178._24_4_ * fVar186;
    auVar34._28_4_ = fStack_13c;
    auVar274 = vfnmadd231ps_fma(auVar34,local_d8,auVar268);
    auVar35._4_4_ = fVar259 * (float)local_408._4_4_;
    auVar35._0_4_ = fVar161 * (float)local_408._0_4_;
    auVar35._8_4_ = fVar270 * (float)uStack_400;
    auVar35._12_4_ = fVar183 * uStack_400._4_4_;
    auVar35._16_4_ = fVar184 * (float)uStack_3f8;
    auVar35._20_4_ = fVar185 * uStack_3f8._4_4_;
    auVar35._24_4_ = fVar186 * (float)uStack_3f0;
    auVar35._28_4_ = local_178._28_4_;
    auVar10 = vfnmadd231ps_fma(auVar35,local_218,auVar268);
    auVar53._4_4_ = fVar160 * fVar259;
    auVar53._0_4_ = fVar142 * fVar161;
    auVar53._8_4_ = fVar162 * fVar270;
    auVar53._12_4_ = fVar164 * fVar183;
    auVar53._16_4_ = fVar184 * 0.0;
    auVar53._20_4_ = fVar185 * 0.0;
    auVar53._24_4_ = fVar186 * 0.0;
    auVar53._28_4_ = DAT_0205d4a0._28_4_;
    auVar11 = vfnmadd231ps_fma(auVar53,auVar258,auVar268);
    auVar36._4_4_ = local_138._4_4_ * fVar259;
    auVar36._0_4_ = local_138._0_4_ * fVar161;
    auVar36._8_4_ = local_138._8_4_ * fVar270;
    auVar36._12_4_ = local_138._12_4_ * fVar183;
    auVar36._16_4_ = local_138._16_4_ * fVar184;
    auVar36._20_4_ = local_138._20_4_ * fVar185;
    auVar36._24_4_ = local_138._24_4_ * fVar186;
    auVar36._28_4_ = local_218._28_4_;
    auVar68 = vfnmadd231ps_fma(auVar36,local_f8,auVar268);
    auVar37._4_4_ = local_118._4_4_ * fVar259;
    auVar37._0_4_ = local_118._0_4_ * fVar161;
    auVar37._8_4_ = local_118._8_4_ * fVar270;
    auVar37._12_4_ = local_118._12_4_ * fVar183;
    auVar37._16_4_ = local_118._16_4_ * fVar184;
    auVar37._20_4_ = local_118._20_4_ * fVar185;
    auVar37._24_4_ = local_118._24_4_ * fVar186;
    auVar37._28_4_ = local_d8._28_4_;
    auVar212 = vfnmadd231ps_fma(auVar37,auVar268,_local_428);
    auVar38._4_4_ = local_78._4_4_ * fVar259;
    auVar38._0_4_ = local_78._0_4_ * fVar161;
    auVar38._8_4_ = local_78._8_4_ * fVar270;
    auVar38._12_4_ = local_78._12_4_ * fVar183;
    auVar38._16_4_ = local_78._16_4_ * fVar184;
    auVar38._20_4_ = local_78._20_4_ * fVar185;
    auVar38._24_4_ = local_78._24_4_ * fVar186;
    auVar38._28_4_ = auVar83._28_4_ + auVar16._28_4_;
    auVar85 = vfnmadd231ps_fma(auVar38,auVar268,local_468);
    auVar14 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar9));
    auVar83 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar9));
    auVar15 = vminps_avx(ZEXT1632(auVar274),ZEXT1632(auVar10));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar274),ZEXT1632(auVar10));
    auVar83 = vmaxps_avx(auVar83,auVar14);
    auVar16 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar68));
    auVar14 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar68));
    auVar17 = vminps_avx(ZEXT1632(auVar212),ZEXT1632(auVar85));
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar212),ZEXT1632(auVar85));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar83,auVar14);
    auVar52._4_4_ = fStack_194;
    auVar52._0_4_ = local_198;
    auVar52._8_4_ = fStack_190;
    auVar52._12_4_ = fStack_18c;
    auVar52._16_4_ = fStack_188;
    auVar52._20_4_ = fStack_184;
    auVar52._24_4_ = fStack_180;
    auVar52._28_4_ = fStack_17c;
    auVar83 = vcmpps_avx(auVar16,auVar52,2);
    auVar51._4_4_ = uStack_1b4;
    auVar51._0_4_ = local_1b8;
    auVar51._8_4_ = uStack_1b0;
    auVar51._12_4_ = uStack_1ac;
    auVar51._16_4_ = uStack_1a8;
    auVar51._20_4_ = uStack_1a4;
    auVar51._24_4_ = uStack_1a0;
    auVar51._28_4_ = uStack_19c;
    auVar14 = vcmpps_avx(auVar14,auVar51,5);
    auVar83 = vandps_avx(auVar14,auVar83);
    auVar14 = local_1f8 & auVar83;
    uVar54 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(local_218,local_98);
      auVar15 = vsubps_avx(local_468,auVar258);
      fVar166 = auVar14._0_4_ + auVar15._0_4_;
      fVar141 = auVar14._4_4_ + auVar15._4_4_;
      fVar161 = auVar14._8_4_ + auVar15._8_4_;
      fVar259 = auVar14._12_4_ + auVar15._12_4_;
      fVar270 = auVar14._16_4_ + auVar15._16_4_;
      fVar183 = auVar14._20_4_ + auVar15._20_4_;
      fVar184 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(_local_408,local_b8);
      auVar17 = vsubps_avx(local_78,ZEXT1632(auVar84));
      auVar96._0_4_ = auVar16._0_4_ + auVar17._0_4_;
      auVar96._4_4_ = auVar16._4_4_ + auVar17._4_4_;
      auVar96._8_4_ = auVar16._8_4_ + auVar17._8_4_;
      auVar96._12_4_ = auVar16._12_4_ + auVar17._12_4_;
      auVar96._16_4_ = auVar16._16_4_ + auVar17._16_4_;
      auVar96._20_4_ = auVar16._20_4_ + auVar17._20_4_;
      auVar96._24_4_ = auVar16._24_4_ + auVar17._24_4_;
      fVar165 = auVar17._28_4_;
      auVar96._28_4_ = auVar16._28_4_ + fVar165;
      auVar277._0_4_ = fVar64 * fVar166;
      auVar277._4_4_ = fVar66 * fVar141;
      auVar277._8_4_ = fVar143 * fVar161;
      auVar277._12_4_ = fVar182 * fVar259;
      auVar277._16_4_ = fVar270 * 0.0;
      auVar277._20_4_ = fVar183 * 0.0;
      auVar277._24_4_ = fVar184 * 0.0;
      auVar277._28_4_ = 0;
      auVar11 = vfnmadd231ps_fma(auVar277,auVar96,local_98);
      auVar39._4_4_ = fVar141 * fStack_154;
      auVar39._0_4_ = fVar166 * local_158;
      auVar39._8_4_ = fVar161 * fStack_150;
      auVar39._12_4_ = fVar259 * fStack_14c;
      auVar39._16_4_ = fVar270 * fStack_148;
      auVar39._20_4_ = fVar183 * fStack_144;
      auVar39._24_4_ = fVar184 * fStack_140;
      auVar39._28_4_ = fVar165;
      auVar47._4_4_ = fVar163;
      auVar47._0_4_ = fVar159;
      auVar47._8_4_ = fVar269;
      auVar47._12_4_ = fVar271;
      auVar47._16_4_ = fStack_478;
      auVar47._20_4_ = fStack_474;
      auVar47._24_4_ = fStack_470;
      auVar47._28_4_ = 0x40400000;
      auVar13 = vfnmadd213ps_fma(auVar47,auVar96,auVar39);
      auVar40._4_4_ = fVar141 * local_178._4_4_;
      auVar40._0_4_ = fVar166 * local_178._0_4_;
      auVar40._8_4_ = fVar161 * local_178._8_4_;
      auVar40._12_4_ = fVar259 * local_178._12_4_;
      auVar40._16_4_ = fVar270 * local_178._16_4_;
      auVar40._20_4_ = fVar183 * local_178._20_4_;
      auVar40._24_4_ = fVar184 * local_178._24_4_;
      auVar40._28_4_ = fVar165;
      auVar9 = vfnmadd213ps_fma(local_d8,auVar96,auVar40);
      auVar41._4_4_ = (float)local_408._4_4_ * fVar141;
      auVar41._0_4_ = (float)local_408._0_4_ * fVar166;
      auVar41._8_4_ = (float)uStack_400 * fVar161;
      auVar41._12_4_ = uStack_400._4_4_ * fVar259;
      auVar41._16_4_ = (float)uStack_3f8 * fVar270;
      auVar41._20_4_ = uStack_3f8._4_4_ * fVar183;
      auVar41._24_4_ = (float)uStack_3f0 * fVar184;
      auVar41._28_4_ = fVar165;
      auVar84 = vfnmadd231ps_fma(auVar41,auVar96,local_218);
      auVar108._0_4_ = fVar142 * fVar166;
      auVar108._4_4_ = fVar160 * fVar141;
      auVar108._8_4_ = fVar162 * fVar161;
      auVar108._12_4_ = fVar164 * fVar259;
      auVar108._16_4_ = fVar270 * 0.0;
      auVar108._20_4_ = fVar183 * 0.0;
      auVar108._24_4_ = fVar184 * 0.0;
      auVar108._28_4_ = 0;
      auVar68 = vfnmadd231ps_fma(auVar108,auVar96,auVar258);
      auVar42._4_4_ = fVar141 * local_138._4_4_;
      auVar42._0_4_ = fVar166 * local_138._0_4_;
      auVar42._8_4_ = fVar161 * local_138._8_4_;
      auVar42._12_4_ = fVar259 * local_138._12_4_;
      auVar42._16_4_ = fVar270 * local_138._16_4_;
      auVar42._20_4_ = fVar183 * local_138._20_4_;
      auVar42._24_4_ = fVar184 * local_138._24_4_;
      auVar42._28_4_ = local_408._28_4_;
      auVar274 = vfnmadd213ps_fma(local_f8,auVar96,auVar42);
      auVar43._4_4_ = fVar141 * local_118._4_4_;
      auVar43._0_4_ = fVar166 * local_118._0_4_;
      auVar43._8_4_ = fVar161 * local_118._8_4_;
      auVar43._12_4_ = fVar259 * local_118._12_4_;
      auVar43._16_4_ = fVar270 * local_118._16_4_;
      auVar43._20_4_ = fVar183 * local_118._20_4_;
      auVar43._24_4_ = fVar184 * local_118._24_4_;
      auVar43._28_4_ = local_408._28_4_;
      auVar10 = vfnmadd213ps_fma(_local_428,auVar96,auVar43);
      auVar44._4_4_ = local_78._4_4_ * fVar141;
      auVar44._0_4_ = local_78._0_4_ * fVar166;
      auVar44._8_4_ = local_78._8_4_ * fVar161;
      auVar44._12_4_ = local_78._12_4_ * fVar259;
      auVar44._16_4_ = local_78._16_4_ * fVar270;
      auVar44._20_4_ = local_78._20_4_ * fVar183;
      auVar44._24_4_ = local_78._24_4_ * fVar184;
      auVar44._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar212 = vfnmadd231ps_fma(auVar44,auVar96,local_468);
      auVar15 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar13));
      auVar14 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar13));
      auVar16 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar84));
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar84));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(ZEXT1632(auVar68),ZEXT1632(auVar274));
      auVar15 = vmaxps_avx(ZEXT1632(auVar68),ZEXT1632(auVar274));
      auVar258 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar212));
      auVar17 = vminps_avx(auVar17,auVar258);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar212));
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,auVar52,2);
      auVar15 = vcmpps_avx(auVar15,auVar51,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar83 = vandps_avx(auVar83,local_1f8);
      auVar15 = auVar83 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar83 = vandps_avx(auVar14,auVar83);
        uVar54 = vmovmskps_avx(auVar83);
      }
    }
    if (uVar54 != 0) {
      auStack_2f8[uVar56] = uVar54;
      uVar167 = vmovlps_avx(local_268);
      *(undefined8 *)(&uStack_1d8 + uVar56 * 2) = uVar167;
      uVar61 = vmovlps_avx(local_4e8);
      auStack_58[uVar56] = uVar61;
      uVar56 = (ulong)((int)uVar56 + 1);
    }
    do {
      if ((int)uVar56 == 0) {
        if ((uVar62 & 1) != 0) {
          return local_549;
        }
        fVar142 = ray->tfar;
        auVar82._4_4_ = fVar142;
        auVar82._0_4_ = fVar142;
        auVar82._8_4_ = fVar142;
        auVar82._12_4_ = fVar142;
        auVar13 = vcmpps_avx(local_278,auVar82,2);
        uVar54 = vmovmskps_avx(auVar13);
        uVar54 = (uint)uVar63 & uVar54;
        local_549 = uVar54 != 0;
        if (!local_549) {
          return local_549;
        }
        goto LAB_0167da27;
      }
      uVar55 = (int)uVar56 - 1;
      uVar57 = (ulong)uVar55;
      uVar60 = auStack_2f8[uVar57];
      uVar54 = (&uStack_1d8)[uVar57 * 2];
      fVar142 = afStack_1d4[uVar57 * 2];
      iVar18 = 0;
      for (uVar61 = (ulong)uVar60; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        iVar18 = iVar18 + 1;
      }
      uVar60 = uVar60 - 1 & uVar60;
      if (uVar60 == 0) {
        uVar56 = (ulong)uVar55;
      }
      local_4e8._8_8_ = 0;
      local_4e8._0_8_ = auStack_58[uVar57];
      auStack_2f8[uVar57] = uVar60;
      fVar160 = (float)(iVar18 + 1) * 0.14285715;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * (float)iVar18 * 0.14285715)),
                                ZEXT416(uVar54),ZEXT416((uint)(1.0 - (float)iVar18 * 0.14285715)));
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar160)),ZEXT416(uVar54),
                               ZEXT416((uint)(1.0 - fVar160)));
      auVar278 = ZEXT1664(auVar9);
      fVar160 = auVar13._0_4_;
      local_488 = auVar9._0_4_;
      fVar142 = local_488 - fVar160;
      local_468._0_16_ = auVar13;
      fStack_484 = auVar9._4_4_;
      uStack_480 = auVar9._8_4_;
      uStack_47c = auVar9._12_4_;
      if (0.16666667 <= fVar142) break;
      auVar274 = vshufps_avx(local_4e8,local_4e8,0x50);
      auVar99._8_4_ = 0x3f800000;
      auVar99._0_8_ = &DAT_3f8000003f800000;
      auVar99._12_4_ = 0x3f800000;
      auVar10 = vsubps_avx(auVar99,auVar274);
      fVar162 = auVar274._0_4_;
      auVar115._0_4_ = fVar110 * fVar162;
      fVar164 = auVar274._4_4_;
      auVar115._4_4_ = fVar124 * fVar164;
      fVar64 = auVar274._8_4_;
      auVar115._8_4_ = fVar110 * fVar64;
      fVar66 = auVar274._12_4_;
      auVar115._12_4_ = fVar124 * fVar66;
      auVar129._0_4_ = fVar187 * fVar162;
      auVar129._4_4_ = fVar204 * fVar164;
      auVar129._8_4_ = fVar187 * fVar64;
      auVar129._12_4_ = fVar204 * fVar66;
      auVar152._0_4_ = fVar231 * fVar162;
      auVar152._4_4_ = fVar242 * fVar164;
      auVar152._8_4_ = fVar231 * fVar64;
      auVar152._12_4_ = fVar242 * fVar66;
      auVar88._0_4_ = fVar221 * fVar162;
      auVar88._4_4_ = fVar230 * fVar164;
      auVar88._8_4_ = fVar221 * fVar64;
      auVar88._12_4_ = fVar230 * fVar66;
      auVar274 = vfmadd231ps_fma(auVar115,auVar10,auVar281);
      auVar11 = vfmadd231ps_fma(auVar129,auVar10,auVar209);
      auVar84 = vfmadd231ps_fma(auVar152,auVar10,auVar87);
      auVar10 = vfmadd231ps_fma(auVar88,auVar98,auVar10);
      auVar109._16_16_ = auVar274;
      auVar109._0_16_ = auVar274;
      auVar122._16_16_ = auVar11;
      auVar122._0_16_ = auVar11;
      auVar140._16_16_ = auVar84;
      auVar140._0_16_ = auVar84;
      auVar181._4_4_ = fVar160;
      auVar181._0_4_ = fVar160;
      auVar181._8_4_ = fVar160;
      auVar181._12_4_ = fVar160;
      auVar181._20_4_ = local_488;
      auVar181._16_4_ = local_488;
      auVar181._24_4_ = local_488;
      auVar181._28_4_ = local_488;
      auVar83 = vsubps_avx(auVar122,auVar109);
      auVar11 = vfmadd213ps_fma(auVar83,auVar181,auVar109);
      auVar83 = vsubps_avx(auVar140,auVar122);
      auVar68 = vfmadd213ps_fma(auVar83,auVar181,auVar122);
      auVar274 = vsubps_avx(auVar10,auVar84);
      auVar123._16_16_ = auVar274;
      auVar123._0_16_ = auVar274;
      auVar274 = vfmadd213ps_fma(auVar123,auVar181,auVar140);
      auVar83 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar11));
      auVar10 = vfmadd213ps_fma(auVar83,auVar181,ZEXT1632(auVar11));
      auVar83 = vsubps_avx(ZEXT1632(auVar274),ZEXT1632(auVar68));
      auVar274 = vfmadd213ps_fma(auVar83,auVar181,ZEXT1632(auVar68));
      auVar83 = vsubps_avx(ZEXT1632(auVar274),ZEXT1632(auVar10));
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar83,auVar181);
      fVar182 = auVar83._4_4_ * 3.0;
      fVar143 = fVar142 * 0.33333334;
      local_218._0_8_ =
           CONCAT44(auVar126._4_4_ + fVar143 * fVar182,
                    auVar126._0_4_ + fVar143 * auVar83._0_4_ * 3.0);
      local_218._8_4_ = auVar126._8_4_ + fVar143 * auVar83._8_4_ * 3.0;
      local_218._12_4_ = auVar126._12_4_ + fVar143 * auVar83._12_4_ * 3.0;
      auVar10 = vshufpd_avx(auVar126,auVar126,3);
      auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_428 = auVar10;
      auVar14 = _local_428;
      auVar274 = vsubps_avx(auVar10,auVar126);
      _local_408 = auVar11;
      auVar84 = vsubps_avx(auVar11,(undefined1  [16])0x0);
      auVar100._0_4_ = auVar274._0_4_ + auVar84._0_4_;
      auVar100._4_4_ = auVar274._4_4_ + auVar84._4_4_;
      auVar100._8_4_ = auVar274._8_4_ + auVar84._8_4_;
      auVar100._12_4_ = auVar274._12_4_ + auVar84._12_4_;
      auVar274 = vshufps_avx(auVar126,auVar126,0xb1);
      auVar84 = vshufps_avx(local_218._0_16_,local_218._0_16_,0xb1);
      auVar261._4_4_ = auVar100._0_4_;
      auVar261._0_4_ = auVar100._0_4_;
      auVar261._8_4_ = auVar100._0_4_;
      auVar261._12_4_ = auVar100._0_4_;
      auVar68 = vshufps_avx(auVar100,auVar100,0x55);
      fVar162 = auVar68._0_4_;
      auVar193._0_4_ = auVar274._0_4_ * fVar162;
      fVar164 = auVar68._4_4_;
      auVar193._4_4_ = auVar274._4_4_ * fVar164;
      fVar64 = auVar68._8_4_;
      auVar193._8_4_ = auVar274._8_4_ * fVar64;
      fVar66 = auVar68._12_4_;
      auVar193._12_4_ = auVar274._12_4_ * fVar66;
      auVar210._0_4_ = auVar84._0_4_ * fVar162;
      auVar210._4_4_ = auVar84._4_4_ * fVar164;
      auVar210._8_4_ = auVar84._8_4_ * fVar64;
      auVar210._12_4_ = auVar84._12_4_ * fVar66;
      auVar212 = vfmadd231ps_fma(auVar193,auVar261,auVar126);
      auVar85 = vfmadd231ps_fma(auVar210,auVar261,local_218._0_16_);
      auVar84 = vshufps_avx(auVar212,auVar212,0xe8);
      auVar68 = vshufps_avx(auVar85,auVar85,0xe8);
      auVar274 = vcmpps_avx(auVar84,auVar68,1);
      uVar54 = vextractps_avx(auVar274,0);
      auVar67 = auVar85;
      if ((uVar54 & 1) == 0) {
        auVar67 = auVar212;
      }
      auVar130._0_4_ = fVar143 * auVar83._16_4_ * 3.0;
      auVar130._4_4_ = fVar143 * fVar182;
      auVar130._8_4_ = fVar143 * auVar83._24_4_ * 3.0;
      auVar130._12_4_ = fVar143 * local_488;
      auVar145 = vsubps_avx((undefined1  [16])0x0,auVar130);
      auVar131 = vshufps_avx(auVar145,auVar145,0xb1);
      auVar125 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar282._0_4_ = auVar131._0_4_ * fVar162;
      auVar282._4_4_ = auVar131._4_4_ * fVar164;
      auVar282._8_4_ = auVar131._8_4_ * fVar64;
      auVar282._12_4_ = auVar131._12_4_ * fVar66;
      auVar101._0_4_ = auVar125._0_4_ * fVar162;
      auVar101._4_4_ = auVar125._4_4_ * fVar164;
      auVar101._8_4_ = auVar125._8_4_ * fVar64;
      auVar101._12_4_ = auVar125._12_4_ * fVar66;
      auVar146 = vfmadd231ps_fma(auVar282,auVar261,auVar145);
      auVar188 = vfmadd231ps_fma(auVar101,(undefined1  [16])0x0,auVar261);
      auVar125 = vshufps_avx(auVar146,auVar146,0xe8);
      auVar144 = vshufps_avx(auVar188,auVar188,0xe8);
      auVar131 = vcmpps_avx(auVar125,auVar144,1);
      uVar54 = vextractps_avx(auVar131,0);
      auVar205 = auVar188;
      if ((uVar54 & 1) == 0) {
        auVar205 = auVar146;
      }
      auVar67 = vmaxss_avx(auVar205,auVar67);
      auVar84 = vminps_avx(auVar84,auVar68);
      auVar68 = vminps_avx(auVar125,auVar144);
      auVar68 = vminps_avx(auVar84,auVar68);
      auVar274 = vshufps_avx(auVar274,auVar274,0x55);
      auVar274 = vblendps_avx(auVar274,auVar131,2);
      auVar131 = vpslld_avx(auVar274,0x1f);
      auVar274 = vshufpd_avx(auVar85,auVar85,1);
      auVar274 = vinsertps_avx(auVar274,auVar188,0x9c);
      auVar84 = vshufpd_avx(auVar212,auVar212,1);
      auVar84 = vinsertps_avx(auVar84,auVar146,0x9c);
      auVar274 = vblendvps_avx(auVar84,auVar274,auVar131);
      auVar84 = vmovshdup_avx(auVar274);
      auVar274 = vmaxss_avx(auVar84,auVar274);
      fVar64 = auVar68._0_4_;
      auVar84 = vmovshdup_avx(auVar68);
      fVar164 = auVar274._0_4_;
      fVar162 = auVar67._0_4_;
      _local_428 = auVar14;
      if ((0.0001 <= fVar64) || (fVar164 <= -0.0001)) {
        auVar212 = vcmpps_avx(auVar84,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar85 = vcmpps_avx(auVar68,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar212 = vorps_avx(auVar85,auVar212);
        if ((-0.0001 < fVar162 & auVar212[0]) != 0) goto LAB_0167eac8;
        auVar212 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar274,5);
        auVar85 = vcmpps_avx(auVar84,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar212 = vorps_avx(auVar85,auVar212);
        if ((auVar212 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0167eac8;
LAB_0167f6f3:
        bVar45 = true;
      }
      else {
LAB_0167eac8:
        auVar85 = vcmpps_avx(auVar68,_DAT_01feba10,1);
        auVar131 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar212 = vcmpss_avx(auVar67,ZEXT816(0) << 0x20,1);
        auVar153._8_4_ = 0x3f800000;
        auVar153._0_8_ = &DAT_3f8000003f800000;
        auVar153._12_4_ = 0x3f800000;
        auVar211._8_4_ = 0xbf800000;
        auVar211._0_8_ = 0xbf800000bf800000;
        auVar211._12_4_ = 0xbf800000;
        auVar212 = vblendvps_avx(auVar153,auVar211,auVar212);
        auVar85 = vblendvps_avx(auVar153,auVar211,auVar85);
        fVar66 = auVar85._0_4_;
        fVar143 = auVar212._0_4_;
        auVar212 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar125 = ZEXT816(0) << 0x20;
        if ((fVar66 == fVar143) && (!NAN(fVar66) && !NAN(fVar143))) {
          auVar212 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar66 == fVar143) && (!NAN(fVar66) && !NAN(fVar143))) {
          auVar131 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar85 = vmovshdup_avx(auVar85);
        fVar182 = auVar85._0_4_;
        if ((fVar66 != fVar182) || (NAN(fVar66) || NAN(fVar182))) {
          fVar66 = auVar84._0_4_;
          if ((fVar66 != fVar64) || (NAN(fVar66) || NAN(fVar64))) {
            auVar102._0_4_ = (float)((uint)fVar64 ^ local_368);
            auVar102._4_4_ = auVar68._4_4_ ^ uStack_364;
            auVar102._8_4_ = auVar68._8_4_ ^ uStack_360;
            auVar102._12_4_ = auVar68._12_4_ ^ uStack_35c;
            auVar132._0_4_ = auVar102._0_4_ / (fVar66 - fVar64);
            auVar132._4_12_ = auVar102._4_12_;
            auVar84 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar132._0_4_)),auVar125,auVar132);
            auVar68 = auVar84;
          }
          else {
            auVar84 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar64 == 0.0) && (auVar84 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar64))) {
              auVar84 = ZEXT816(0);
            }
            auVar68 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar64 == 0.0) && (auVar68 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar64))) {
              auVar68 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar212 = vminss_avx(auVar212,auVar84);
          auVar131 = vmaxss_avx(auVar68,auVar131);
        }
        auVar274 = vcmpss_avx(auVar274,auVar125,1);
        auVar133._8_4_ = 0x3f800000;
        auVar133._0_8_ = &DAT_3f8000003f800000;
        auVar133._12_4_ = 0x3f800000;
        auVar154._8_4_ = 0xbf800000;
        auVar154._0_8_ = 0xbf800000bf800000;
        auVar154._12_4_ = 0xbf800000;
        auVar274 = vblendvps_avx(auVar133,auVar154,auVar274);
        fVar64 = auVar274._0_4_;
        auVar274 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar143 != fVar64) || (NAN(fVar143) || NAN(fVar64))) {
          if ((fVar164 != fVar162) || (NAN(fVar164) || NAN(fVar162))) {
            auVar103._0_4_ = (float)((uint)fVar162 ^ local_368);
            auVar103._4_4_ = auVar67._4_4_ ^ uStack_364;
            auVar103._8_4_ = auVar67._8_4_ ^ uStack_360;
            auVar103._12_4_ = auVar67._12_4_ ^ uStack_35c;
            auVar134._0_4_ = auVar103._0_4_ / (fVar164 - fVar162);
            auVar134._4_12_ = auVar103._4_12_;
            auVar84 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar134._0_4_)),auVar125,auVar134);
            auVar68 = auVar84;
          }
          else {
            auVar84 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar162 == 0.0) && (auVar84 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar162))) {
              auVar84 = ZEXT816(0);
            }
            auVar68 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar162 == 0.0) && (auVar68 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar162))) {
              auVar68 = auVar274;
            }
          }
          auVar212 = vminss_avx(auVar212,auVar84);
          auVar131 = vmaxss_avx(auVar68,auVar131);
        }
        if ((fVar182 != fVar64) || (NAN(fVar182) || NAN(fVar64))) {
          auVar212 = vminss_avx(auVar212,auVar274);
          auVar131 = vmaxss_avx(auVar274,auVar131);
        }
        auVar84 = vmaxss_avx(auVar125,auVar212);
        auVar68 = vminss_avx(auVar131,auVar274);
        bVar45 = true;
        if (auVar84._0_4_ <= auVar68._0_4_) {
          auVar84 = vmaxss_avx(auVar125,ZEXT416((uint)(auVar84._0_4_ + -0.1)));
          auVar274 = vminss_avx(ZEXT416((uint)(auVar68._0_4_ + 0.1)),auVar274);
          auVar89._0_8_ = auVar126._0_8_;
          auVar89._8_8_ = auVar89._0_8_;
          auVar213._8_8_ = local_218._0_8_;
          auVar213._0_8_ = local_218._0_8_;
          auVar225._8_8_ = auVar145._0_8_;
          auVar225._0_8_ = auVar145._0_8_;
          auVar68 = vshufpd_avx(local_218._0_16_,local_218._0_16_,3);
          auVar212 = vshufpd_avx(auVar145,auVar145,3);
          auVar85 = vshufps_avx(auVar84,auVar274,0);
          auVar116._8_4_ = 0x3f800000;
          auVar116._0_8_ = &DAT_3f8000003f800000;
          auVar116._12_4_ = 0x3f800000;
          auVar126 = vsubps_avx(auVar116,auVar85);
          local_428._0_4_ = auVar10._0_4_;
          local_428._4_4_ = auVar10._4_4_;
          fStack_420 = auVar10._8_4_;
          fStack_41c = auVar10._12_4_;
          fVar162 = auVar85._0_4_;
          auVar117._0_4_ = fVar162 * (float)local_428._0_4_;
          fVar164 = auVar85._4_4_;
          auVar117._4_4_ = fVar164 * (float)local_428._4_4_;
          fVar64 = auVar85._8_4_;
          auVar117._8_4_ = fVar64 * fStack_420;
          fVar66 = auVar85._12_4_;
          auVar117._12_4_ = fVar66 * fStack_41c;
          auVar135._0_4_ = auVar68._0_4_ * fVar162;
          auVar135._4_4_ = auVar68._4_4_ * fVar164;
          auVar135._8_4_ = auVar68._8_4_ * fVar64;
          auVar135._12_4_ = auVar68._12_4_ * fVar66;
          auVar155._0_4_ = auVar212._0_4_ * fVar162;
          auVar155._4_4_ = auVar212._4_4_ * fVar164;
          auVar155._8_4_ = auVar212._8_4_ * fVar64;
          auVar155._12_4_ = auVar212._12_4_ * fVar66;
          local_408._0_4_ = auVar11._0_4_;
          local_408._4_4_ = auVar11._4_4_;
          uStack_400._0_4_ = auVar11._8_4_;
          uStack_400._4_4_ = auVar11._12_4_;
          auVar176._0_4_ = fVar162 * (float)local_408._0_4_;
          auVar176._4_4_ = fVar164 * (float)local_408._4_4_;
          auVar176._8_4_ = fVar64 * (float)uStack_400;
          auVar176._12_4_ = fVar66 * uStack_400._4_4_;
          auVar68 = vfmadd231ps_fma(auVar117,auVar126,auVar89);
          auVar212 = vfmadd231ps_fma(auVar135,auVar126,auVar213);
          auVar85 = vfmadd231ps_fma(auVar155,auVar126,auVar225);
          auVar126 = vfmadd231ps_fma(auVar176,auVar126,ZEXT816(0));
          auVar10 = vmovshdup_avx(local_4e8);
          auVar131 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar84._0_4_)),local_4e8,
                                     ZEXT416((uint)(1.0 - auVar84._0_4_)));
          auVar125 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar274._0_4_)),local_4e8,
                                     ZEXT416((uint)(1.0 - auVar274._0_4_)));
          fVar162 = 1.0 / fVar142;
          auVar274 = vsubps_avx(auVar212,auVar68);
          auVar194._0_4_ = auVar274._0_4_ * 3.0;
          auVar194._4_4_ = auVar274._4_4_ * 3.0;
          auVar194._8_4_ = auVar274._8_4_ * 3.0;
          auVar194._12_4_ = auVar274._12_4_ * 3.0;
          auVar274 = vsubps_avx(auVar85,auVar212);
          auVar214._0_4_ = auVar274._0_4_ * 3.0;
          auVar214._4_4_ = auVar274._4_4_ * 3.0;
          auVar214._8_4_ = auVar274._8_4_ * 3.0;
          auVar214._12_4_ = auVar274._12_4_ * 3.0;
          auVar274 = vsubps_avx(auVar126,auVar85);
          auVar226._0_4_ = auVar274._0_4_ * 3.0;
          auVar226._4_4_ = auVar274._4_4_ * 3.0;
          auVar226._8_4_ = auVar274._8_4_ * 3.0;
          auVar226._12_4_ = auVar274._12_4_ * 3.0;
          auVar10 = vminps_avx(auVar214,auVar226);
          auVar274 = vmaxps_avx(auVar214,auVar226);
          auVar10 = vminps_avx(auVar194,auVar10);
          auVar274 = vmaxps_avx(auVar194,auVar274);
          auVar11 = vshufpd_avx(auVar10,auVar10,3);
          auVar84 = vshufpd_avx(auVar274,auVar274,3);
          auVar10 = vminps_avx(auVar10,auVar11);
          auVar274 = vmaxps_avx(auVar274,auVar84);
          auVar215._0_4_ = auVar10._0_4_ * fVar162;
          auVar215._4_4_ = auVar10._4_4_ * fVar162;
          auVar215._8_4_ = auVar10._8_4_ * fVar162;
          auVar215._12_4_ = auVar10._12_4_ * fVar162;
          auVar195._0_4_ = fVar162 * auVar274._0_4_;
          auVar195._4_4_ = fVar162 * auVar274._4_4_;
          auVar195._8_4_ = fVar162 * auVar274._8_4_;
          auVar195._12_4_ = fVar162 * auVar274._12_4_;
          fVar162 = 1.0 / (auVar125._0_4_ - auVar131._0_4_);
          auVar274 = vshufpd_avx(auVar68,auVar68,3);
          auVar10 = vshufpd_avx(auVar212,auVar212,3);
          auVar11 = vshufpd_avx(auVar85,auVar85,3);
          auVar84 = vshufpd_avx(auVar126,auVar126,3);
          auVar274 = vsubps_avx(auVar274,auVar68);
          auVar68 = vsubps_avx(auVar10,auVar212);
          auVar212 = vsubps_avx(auVar11,auVar85);
          auVar84 = vsubps_avx(auVar84,auVar126);
          auVar10 = vminps_avx(auVar274,auVar68);
          auVar274 = vmaxps_avx(auVar274,auVar68);
          auVar11 = vminps_avx(auVar212,auVar84);
          auVar11 = vminps_avx(auVar10,auVar11);
          auVar10 = vmaxps_avx(auVar212,auVar84);
          auVar274 = vmaxps_avx(auVar274,auVar10);
          auVar246._0_4_ = fVar162 * auVar11._0_4_;
          auVar246._4_4_ = fVar162 * auVar11._4_4_;
          auVar246._8_4_ = fVar162 * auVar11._8_4_;
          auVar246._12_4_ = fVar162 * auVar11._12_4_;
          auVar237._0_4_ = fVar162 * auVar274._0_4_;
          auVar237._4_4_ = fVar162 * auVar274._4_4_;
          auVar237._8_4_ = fVar162 * auVar274._8_4_;
          auVar237._12_4_ = fVar162 * auVar274._12_4_;
          auVar11 = vinsertps_avx(auVar13,auVar131,0x10);
          auVar84 = vinsertps_avx(auVar9,auVar125,0x10);
          auVar81._0_4_ = (auVar11._0_4_ + auVar84._0_4_) * 0.5;
          auVar81._4_4_ = (auVar11._4_4_ + auVar84._4_4_) * 0.5;
          auVar81._8_4_ = (auVar11._8_4_ + auVar84._8_4_) * 0.5;
          auVar81._12_4_ = (auVar11._12_4_ + auVar84._12_4_) * 0.5;
          auVar118._4_4_ = auVar81._0_4_;
          auVar118._0_4_ = auVar81._0_4_;
          auVar118._8_4_ = auVar81._0_4_;
          auVar118._12_4_ = auVar81._0_4_;
          auVar9 = vfmadd213ps_fma(local_228,auVar118,local_498);
          auVar274 = vfmadd213ps_fma(local_238,auVar118,local_4a8);
          auVar10 = vfmadd213ps_fma(local_248,auVar118,local_348);
          auVar13 = vsubps_avx(auVar274,auVar9);
          auVar9 = vfmadd213ps_fma(auVar13,auVar118,auVar9);
          auVar13 = vsubps_avx(auVar10,auVar274);
          auVar13 = vfmadd213ps_fma(auVar13,auVar118,auVar274);
          auVar13 = vsubps_avx(auVar13,auVar9);
          auVar9 = vfmadd231ps_fma(auVar9,auVar13,auVar118);
          auVar119._0_8_ = CONCAT44(auVar13._4_4_ * 3.0,auVar13._0_4_ * 3.0);
          auVar119._8_4_ = auVar13._8_4_ * 3.0;
          auVar119._12_4_ = auVar13._12_4_ * 3.0;
          auVar227._8_8_ = auVar9._0_8_;
          auVar227._0_8_ = auVar9._0_8_;
          auVar13 = vshufpd_avx(auVar9,auVar9,3);
          auVar9 = vshufps_avx(auVar81,auVar81,0x55);
          auVar68 = vsubps_avx(auVar13,auVar227);
          auVar85 = vfmadd231ps_fma(auVar227,auVar9,auVar68);
          auVar262._8_8_ = auVar119._0_8_;
          auVar262._0_8_ = auVar119._0_8_;
          auVar13 = vshufpd_avx(auVar119,auVar119,3);
          auVar13 = vsubps_avx(auVar13,auVar262);
          auVar212 = vfmadd213ps_fma(auVar13,auVar9,auVar262);
          auVar9 = vmovshdup_avx(auVar212);
          auVar263._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
          auVar263._8_4_ = auVar9._8_4_ ^ 0x80000000;
          auVar263._12_4_ = auVar9._12_4_ ^ 0x80000000;
          auVar274 = vmovshdup_avx(auVar68);
          auVar13 = vunpcklps_avx(auVar274,auVar263);
          auVar10 = vshufps_avx(auVar13,auVar263,4);
          auVar283._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
          auVar283._8_4_ = auVar68._8_4_ ^ 0x80000000;
          auVar283._12_4_ = auVar68._12_4_ ^ 0x80000000;
          auVar13 = vmovlhps_avx(auVar283,auVar212);
          auVar13 = vshufps_avx(auVar13,auVar212,8);
          auVar9 = vfmsub231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar68._0_4_)),auVar274,auVar212);
          auVar136._0_4_ = auVar9._0_4_;
          auVar136._4_4_ = auVar136._0_4_;
          auVar136._8_4_ = auVar136._0_4_;
          auVar136._12_4_ = auVar136._0_4_;
          auVar9 = vdivps_avx(auVar10,auVar136);
          auVar274 = vdivps_avx(auVar13,auVar136);
          fVar64 = auVar85._0_4_;
          fVar162 = auVar9._0_4_;
          auVar13 = vshufps_avx(auVar85,auVar85,0x55);
          fVar164 = auVar274._0_4_;
          local_408._4_4_ = fVar64 * auVar9._4_4_ + auVar13._4_4_ * auVar274._4_4_;
          local_408._0_4_ = fVar64 * fVar162 + auVar13._0_4_ * fVar164;
          uStack_400._0_4_ = fVar64 * auVar9._8_4_ + auVar13._8_4_ * auVar274._8_4_;
          uStack_400._4_4_ = fVar64 * auVar9._12_4_ + auVar13._12_4_ * auVar274._12_4_;
          auVar68 = vmovshdup_avx(auVar9);
          auVar13 = vinsertps_avx(auVar215,auVar246,0x1c);
          auVar275._0_4_ = auVar68._0_4_ * auVar13._0_4_;
          auVar275._4_4_ = auVar68._4_4_ * auVar13._4_4_;
          auVar275._8_4_ = auVar68._8_4_ * auVar13._8_4_;
          auVar275._12_4_ = auVar68._12_4_ * auVar13._12_4_;
          auVar10 = vinsertps_avx(auVar195,auVar237,0x1c);
          auVar253._0_4_ = auVar68._0_4_ * auVar10._0_4_;
          auVar253._4_4_ = auVar68._4_4_ * auVar10._4_4_;
          auVar253._8_4_ = auVar68._8_4_ * auVar10._8_4_;
          auVar253._12_4_ = auVar68._12_4_ * auVar10._12_4_;
          auVar126 = vminps_avx(auVar275,auVar253);
          auVar85 = vmaxps_avx(auVar253,auVar275);
          auVar68 = vinsertps_avx(auVar246,auVar215,0x4c);
          auVar67 = vmovshdup_avx(auVar274);
          auVar212 = vinsertps_avx(auVar237,auVar195,0x4c);
          auVar238._0_4_ = auVar67._0_4_ * auVar68._0_4_;
          auVar238._4_4_ = auVar67._4_4_ * auVar68._4_4_;
          auVar238._8_4_ = auVar67._8_4_ * auVar68._8_4_;
          auVar238._12_4_ = auVar67._12_4_ * auVar68._12_4_;
          auVar247._0_4_ = auVar67._0_4_ * auVar212._0_4_;
          auVar247._4_4_ = auVar67._4_4_ * auVar212._4_4_;
          auVar247._8_4_ = auVar67._8_4_ * auVar212._8_4_;
          auVar247._12_4_ = auVar67._12_4_ * auVar212._12_4_;
          auVar67 = vminps_avx(auVar238,auVar247);
          auVar90._0_4_ = auVar67._0_4_ + auVar126._0_4_;
          auVar90._4_4_ = auVar67._4_4_ + auVar126._4_4_;
          auVar90._8_4_ = auVar67._8_4_ + auVar126._8_4_;
          auVar90._12_4_ = auVar67._12_4_ + auVar126._12_4_;
          auVar126 = vmaxps_avx(auVar247,auVar238);
          auVar239._0_4_ = auVar85._0_4_ + auVar126._0_4_;
          auVar239._4_4_ = auVar85._4_4_ + auVar126._4_4_;
          auVar239._8_4_ = auVar85._8_4_ + auVar126._8_4_;
          auVar239._12_4_ = auVar85._12_4_ + auVar126._12_4_;
          auVar248._8_8_ = 0x3f80000000000000;
          auVar248._0_8_ = 0x3f80000000000000;
          auVar85 = vsubps_avx(auVar248,auVar239);
          auVar126 = vsubps_avx(auVar248,auVar90);
          auVar67 = vsubps_avx(auVar11,auVar81);
          auVar264._0_4_ = fVar162 * auVar13._0_4_;
          auVar264._4_4_ = fVar162 * auVar13._4_4_;
          auVar264._8_4_ = fVar162 * auVar13._8_4_;
          auVar264._12_4_ = fVar162 * auVar13._12_4_;
          auVar254._0_4_ = fVar162 * auVar10._0_4_;
          auVar254._4_4_ = fVar162 * auVar10._4_4_;
          auVar254._8_4_ = fVar162 * auVar10._8_4_;
          auVar254._12_4_ = fVar162 * auVar10._12_4_;
          auVar10 = vminps_avx(auVar264,auVar254);
          auVar13 = vmaxps_avx(auVar254,auVar264);
          auVar216._0_4_ = fVar164 * auVar68._0_4_;
          auVar216._4_4_ = fVar164 * auVar68._4_4_;
          auVar216._8_4_ = fVar164 * auVar68._8_4_;
          auVar216._12_4_ = fVar164 * auVar68._12_4_;
          auVar196._0_4_ = fVar164 * auVar212._0_4_;
          auVar196._4_4_ = fVar164 * auVar212._4_4_;
          auVar196._8_4_ = fVar164 * auVar212._8_4_;
          auVar196._12_4_ = fVar164 * auVar212._12_4_;
          auVar68 = vminps_avx(auVar216,auVar196);
          auVar265._0_4_ = auVar10._0_4_ + auVar68._0_4_;
          auVar265._4_4_ = auVar10._4_4_ + auVar68._4_4_;
          auVar265._8_4_ = auVar10._8_4_ + auVar68._8_4_;
          auVar265._12_4_ = auVar10._12_4_ + auVar68._12_4_;
          auVar68 = vsubps_avx(auVar84,auVar81);
          auVar10 = vmaxps_avx(auVar196,auVar216);
          fVar64 = auVar67._0_4_;
          auVar217._0_4_ = fVar64 * auVar85._0_4_;
          fVar66 = auVar67._4_4_;
          auVar217._4_4_ = fVar66 * auVar85._4_4_;
          fVar143 = auVar67._8_4_;
          auVar217._8_4_ = fVar143 * auVar85._8_4_;
          fVar182 = auVar67._12_4_;
          auVar217._12_4_ = fVar182 * auVar85._12_4_;
          auVar197._0_4_ = auVar13._0_4_ + auVar10._0_4_;
          auVar197._4_4_ = auVar13._4_4_ + auVar10._4_4_;
          auVar197._8_4_ = auVar13._8_4_ + auVar10._8_4_;
          auVar197._12_4_ = auVar13._12_4_ + auVar10._12_4_;
          auVar255._8_8_ = 0x3f800000;
          auVar255._0_8_ = 0x3f800000;
          auVar13 = vsubps_avx(auVar255,auVar197);
          auVar10 = vsubps_avx(auVar255,auVar265);
          auVar266._0_4_ = fVar64 * auVar126._0_4_;
          auVar266._4_4_ = fVar66 * auVar126._4_4_;
          auVar266._8_4_ = fVar143 * auVar126._8_4_;
          auVar266._12_4_ = fVar182 * auVar126._12_4_;
          fVar165 = auVar68._0_4_;
          auVar240._0_4_ = fVar165 * auVar85._0_4_;
          fVar166 = auVar68._4_4_;
          auVar240._4_4_ = fVar166 * auVar85._4_4_;
          fVar141 = auVar68._8_4_;
          auVar240._8_4_ = fVar141 * auVar85._8_4_;
          fVar159 = auVar68._12_4_;
          auVar240._12_4_ = fVar159 * auVar85._12_4_;
          auVar91._0_4_ = fVar165 * auVar126._0_4_;
          auVar91._4_4_ = fVar166 * auVar126._4_4_;
          auVar91._8_4_ = fVar141 * auVar126._8_4_;
          auVar91._12_4_ = fVar159 * auVar126._12_4_;
          auVar284._0_4_ = fVar64 * auVar13._0_4_;
          auVar284._4_4_ = fVar66 * auVar13._4_4_;
          auVar284._8_4_ = fVar143 * auVar13._8_4_;
          auVar284._12_4_ = fVar182 * auVar13._12_4_;
          auVar249._0_4_ = fVar64 * auVar10._0_4_;
          auVar249._4_4_ = fVar66 * auVar10._4_4_;
          auVar249._8_4_ = fVar143 * auVar10._8_4_;
          auVar249._12_4_ = fVar182 * auVar10._12_4_;
          auVar198._0_4_ = fVar165 * auVar13._0_4_;
          auVar198._4_4_ = fVar166 * auVar13._4_4_;
          auVar198._8_4_ = fVar141 * auVar13._8_4_;
          auVar198._12_4_ = fVar159 * auVar13._12_4_;
          auVar256._0_4_ = fVar165 * auVar10._0_4_;
          auVar256._4_4_ = fVar166 * auVar10._4_4_;
          auVar256._8_4_ = fVar141 * auVar10._8_4_;
          auVar256._12_4_ = fVar159 * auVar10._12_4_;
          auVar13 = vminps_avx(auVar284,auVar249);
          auVar10 = vminps_avx(auVar198,auVar256);
          auVar13 = vminps_avx(auVar13,auVar10);
          auVar10 = vmaxps_avx(auVar249,auVar284);
          auVar68 = vminps_avx(auVar217,auVar266);
          auVar212 = vminps_avx(auVar240,auVar91);
          auVar68 = vminps_avx(auVar68,auVar212);
          auVar13 = vhaddps_avx(auVar13,auVar68);
          auVar68 = vmaxps_avx(auVar256,auVar198);
          auVar10 = vmaxps_avx(auVar68,auVar10);
          auVar68 = vmaxps_avx(auVar266,auVar217);
          auVar212 = vmaxps_avx(auVar91,auVar240);
          auVar68 = vmaxps_avx(auVar212,auVar68);
          auVar10 = vhaddps_avx(auVar10,auVar68);
          auVar68 = vshufps_avx(auVar81,auVar81,0x54);
          auVar68 = vsubps_avx(auVar68,_local_408);
          auVar13 = vshufps_avx(auVar13,auVar13,0xe8);
          auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
          auVar218._0_4_ = auVar68._0_4_ + auVar13._0_4_;
          auVar218._4_4_ = auVar68._4_4_ + auVar13._4_4_;
          auVar218._8_4_ = auVar68._8_4_ + auVar13._8_4_;
          auVar218._12_4_ = auVar68._12_4_ + auVar13._12_4_;
          auVar199._0_4_ = auVar68._0_4_ + auVar10._0_4_;
          auVar199._4_4_ = auVar68._4_4_ + auVar10._4_4_;
          auVar199._8_4_ = auVar68._8_4_ + auVar10._8_4_;
          auVar199._12_4_ = auVar68._12_4_ + auVar10._12_4_;
          auVar13 = vmaxps_avx(auVar11,auVar218);
          auVar10 = vminps_avx(auVar199,auVar84);
          auVar13 = vcmpps_avx(auVar10,auVar13,1);
          auVar13 = vshufps_avx(auVar13,auVar13,0x50);
          local_4e8 = vinsertps_avx(auVar131,ZEXT416((uint)auVar125._0_4_),0x10);
          if ((auVar13 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar13[0xf] < '\0') goto LAB_0167f6f3;
          bVar59 = 0;
          if ((fVar160 < auVar218._0_4_) && (bVar59 = 0, auVar199._0_4_ < auVar84._0_4_)) {
            auVar10 = vmovshdup_avx(auVar218);
            auVar13 = vcmpps_avx(auVar199,auVar84,1);
            bVar59 = auVar13[4] & auVar131._0_4_ < auVar10._0_4_;
          }
          if (((3 < (uint)uVar56 || fVar142 < 0.001) | bVar59) == 1) {
            lVar58 = 200;
            do {
              fVar66 = auVar68._0_4_;
              fVar64 = 1.0 - fVar66;
              fVar142 = fVar64 * fVar64 * fVar64;
              fVar160 = fVar66 * 3.0 * fVar64 * fVar64;
              fVar64 = fVar64 * fVar66 * fVar66 * 3.0;
              auVar156._4_4_ = fVar142;
              auVar156._0_4_ = fVar142;
              auVar156._8_4_ = fVar142;
              auVar156._12_4_ = fVar142;
              auVar104._4_4_ = fVar160;
              auVar104._0_4_ = fVar160;
              auVar104._8_4_ = fVar160;
              auVar104._12_4_ = fVar160;
              auVar92._4_4_ = fVar64;
              auVar92._0_4_ = fVar64;
              auVar92._8_4_ = fVar64;
              auVar92._12_4_ = fVar64;
              fVar66 = fVar66 * fVar66 * fVar66;
              auVar177._0_4_ = (float)local_258._0_4_ * fVar66;
              auVar177._4_4_ = (float)local_258._4_4_ * fVar66;
              auVar177._8_4_ = fStack_250 * fVar66;
              auVar177._12_4_ = fStack_24c * fVar66;
              auVar13 = vfmadd231ps_fma(auVar177,local_348,auVar92);
              auVar13 = vfmadd231ps_fma(auVar13,local_4a8,auVar104);
              auVar13 = vfmadd231ps_fma(auVar13,local_498,auVar156);
              auVar93._8_8_ = auVar13._0_8_;
              auVar93._0_8_ = auVar13._0_8_;
              auVar13 = vshufpd_avx(auVar13,auVar13,3);
              auVar10 = vshufps_avx(auVar68,auVar68,0x55);
              auVar13 = vsubps_avx(auVar13,auVar93);
              auVar10 = vfmadd213ps_fma(auVar13,auVar10,auVar93);
              fVar142 = auVar10._0_4_;
              auVar13 = vshufps_avx(auVar10,auVar10,0x55);
              auVar94._0_4_ = fVar162 * fVar142 + fVar164 * auVar13._0_4_;
              auVar94._4_4_ = auVar9._4_4_ * fVar142 + auVar274._4_4_ * auVar13._4_4_;
              auVar94._8_4_ = auVar9._8_4_ * fVar142 + auVar274._8_4_ * auVar13._8_4_;
              auVar94._12_4_ = auVar9._12_4_ * fVar142 + auVar274._12_4_ * auVar13._12_4_;
              auVar68 = vsubps_avx(auVar68,auVar94);
              auVar13 = vandps_avx(local_358,auVar10);
              auVar10 = vshufps_avx(auVar13,auVar13,0xf5);
              auVar13 = vmaxss_avx(auVar10,auVar13);
              if (auVar13._0_4_ < (float)local_448._0_4_) {
                fVar142 = auVar68._0_4_;
                if ((0.0 <= fVar142) && (fVar142 <= 1.0)) {
                  auVar13 = vmovshdup_avx(auVar68);
                  fVar160 = auVar13._0_4_;
                  if ((0.0 <= fVar160) && (fVar160 <= 1.0)) {
                    auVar13 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                            ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c)
                    ;
                    auVar85 = vinsertps_avx(auVar13,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                  [2]),0x28);
                    aVar2 = (ray->org).field_0;
                    auVar13 = vsubps_avx(local_378,(undefined1  [16])aVar2);
                    auVar13 = vdpps_avx(auVar13,auVar85,0x7f);
                    auVar9 = vsubps_avx(local_3a8,(undefined1  [16])aVar2);
                    auVar9 = vdpps_avx(auVar9,auVar85,0x7f);
                    auVar274 = vsubps_avx(local_3b8,(undefined1  [16])aVar2);
                    auVar274 = vdpps_avx(auVar274,auVar85,0x7f);
                    auVar10 = vsubps_avx(local_398,(undefined1  [16])aVar2);
                    auVar10 = vdpps_avx(auVar10,auVar85,0x7f);
                    auVar11 = vsubps_avx(_local_388,(undefined1  [16])aVar2);
                    auVar11 = vdpps_avx(auVar11,auVar85,0x7f);
                    auVar84 = vsubps_avx(_local_3c8,(undefined1  [16])aVar2);
                    auVar84 = vdpps_avx(auVar84,auVar85,0x7f);
                    auVar212 = vsubps_avx(_local_3d8,(undefined1  [16])aVar2);
                    auVar212 = vdpps_avx(auVar212,auVar85,0x7f);
                    auVar50._4_4_ = fStack_3e4;
                    auVar50._0_4_ = local_3e8;
                    auVar50._8_4_ = fStack_3e0;
                    auVar50._12_4_ = fStack_3dc;
                    auVar126 = vsubps_avx(auVar50,(undefined1  [16])aVar2);
                    auVar85 = vdpps_avx(auVar126,auVar85,0x7f);
                    fVar162 = 1.0 - fVar160;
                    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar160)),
                                              ZEXT416((uint)fVar162),auVar13);
                    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ * fVar160)),
                                             ZEXT416((uint)fVar162),auVar9);
                    auVar274 = vfmadd231ss_fma(ZEXT416((uint)(auVar212._0_4_ * fVar160)),
                                               ZEXT416((uint)fVar162),auVar274);
                    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * auVar85._0_4_)),
                                              ZEXT416((uint)fVar162),auVar10);
                    fVar64 = 1.0 - fVar142;
                    fVar160 = fVar64 * fVar142 * fVar142 * 3.0;
                    fVar143 = fVar142 * fVar142 * fVar142;
                    auVar274 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar143)),
                                               ZEXT416((uint)fVar160),auVar274);
                    fVar162 = fVar142 * 3.0 * fVar64 * fVar64;
                    auVar9 = vfmadd231ss_fma(auVar274,ZEXT416((uint)fVar162),auVar9);
                    fVar164 = fVar64 * fVar64 * fVar64;
                    auVar13 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar164),auVar13);
                    fVar66 = auVar13._0_4_;
                    if ((ray->org).field_0.m128[3] <= fVar66) {
                      local_408._0_4_ = ray->tfar;
                      if (fVar66 <= ray->tfar) {
                        pGVar5 = (context->scene->geometries).items[local_430].ptr;
                        if ((pGVar5->mask & ray->mask) == 0) {
                          bVar59 = 0;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar59 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar13 = vshufps_avx(auVar68,auVar68,0x55);
                          auVar219._8_4_ = 0x3f800000;
                          auVar219._0_8_ = &DAT_3f8000003f800000;
                          auVar219._12_4_ = 0x3f800000;
                          auVar9 = vsubps_avx(auVar219,auVar13);
                          fVar182 = auVar13._0_4_;
                          auVar228._0_4_ = fVar182 * (float)local_388._0_4_;
                          fVar165 = auVar13._4_4_;
                          auVar228._4_4_ = fVar165 * (float)local_388._4_4_;
                          fVar166 = auVar13._8_4_;
                          auVar228._8_4_ = fVar166 * fStack_380;
                          fVar141 = auVar13._12_4_;
                          auVar228._12_4_ = fVar141 * fStack_37c;
                          auVar241._0_4_ = fVar182 * (float)local_3c8._0_4_;
                          auVar241._4_4_ = fVar165 * (float)local_3c8._4_4_;
                          auVar241._8_4_ = fVar166 * fStack_3c0;
                          auVar241._12_4_ = fVar141 * fStack_3bc;
                          auVar250._0_4_ = fVar182 * (float)local_3d8._0_4_;
                          auVar250._4_4_ = fVar165 * (float)local_3d8._4_4_;
                          auVar250._8_4_ = fVar166 * fStack_3d0;
                          auVar250._12_4_ = fVar141 * fStack_3cc;
                          auVar200._0_4_ = fVar182 * local_3e8;
                          auVar200._4_4_ = fVar165 * fStack_3e4;
                          auVar200._8_4_ = fVar166 * fStack_3e0;
                          auVar200._12_4_ = fVar141 * fStack_3dc;
                          auVar13 = vfmadd231ps_fma(auVar228,auVar9,local_378);
                          auVar274 = vfmadd231ps_fma(auVar241,auVar9,local_3a8);
                          auVar10 = vfmadd231ps_fma(auVar250,auVar9,local_3b8);
                          auVar11 = vfmadd231ps_fma(auVar200,auVar9,local_398);
                          auVar13 = vsubps_avx(auVar274,auVar13);
                          auVar9 = vsubps_avx(auVar10,auVar274);
                          auVar274 = vsubps_avx(auVar11,auVar10);
                          auVar251._0_4_ = fVar142 * auVar9._0_4_;
                          auVar251._4_4_ = fVar142 * auVar9._4_4_;
                          auVar251._8_4_ = fVar142 * auVar9._8_4_;
                          auVar251._12_4_ = fVar142 * auVar9._12_4_;
                          auVar178._4_4_ = fVar64;
                          auVar178._0_4_ = fVar64;
                          auVar178._8_4_ = fVar64;
                          auVar178._12_4_ = fVar64;
                          auVar13 = vfmadd231ps_fma(auVar251,auVar178,auVar13);
                          auVar201._0_4_ = fVar142 * auVar274._0_4_;
                          auVar201._4_4_ = fVar142 * auVar274._4_4_;
                          auVar201._8_4_ = fVar142 * auVar274._8_4_;
                          auVar201._12_4_ = fVar142 * auVar274._12_4_;
                          auVar9 = vfmadd231ps_fma(auVar201,auVar178,auVar9);
                          auVar202._0_4_ = fVar142 * auVar9._0_4_;
                          auVar202._4_4_ = fVar142 * auVar9._4_4_;
                          auVar202._8_4_ = fVar142 * auVar9._8_4_;
                          auVar202._12_4_ = fVar142 * auVar9._12_4_;
                          auVar9 = vfmadd231ps_fma(auVar202,auVar178,auVar13);
                          auVar157._0_4_ = fVar143 * (float)local_2b8._0_4_;
                          auVar157._4_4_ = fVar143 * (float)local_2b8._4_4_;
                          auVar157._8_4_ = fVar143 * fStack_2b0;
                          auVar157._12_4_ = fVar143 * fStack_2ac;
                          auVar105._4_4_ = fVar160;
                          auVar105._0_4_ = fVar160;
                          auVar105._8_4_ = fVar160;
                          auVar105._12_4_ = fVar160;
                          auVar13 = vfmadd132ps_fma(auVar105,auVar157,local_2a8);
                          auVar137._4_4_ = fVar162;
                          auVar137._0_4_ = fVar162;
                          auVar137._8_4_ = fVar162;
                          auVar137._12_4_ = fVar162;
                          auVar13 = vfmadd132ps_fma(auVar137,auVar13,local_298);
                          auVar106._0_4_ = auVar9._0_4_ * 3.0;
                          auVar106._4_4_ = auVar9._4_4_ * 3.0;
                          auVar106._8_4_ = auVar9._8_4_ * 3.0;
                          auVar106._12_4_ = auVar9._12_4_ * 3.0;
                          auVar120._4_4_ = fVar164;
                          auVar120._0_4_ = fVar164;
                          auVar120._8_4_ = fVar164;
                          auVar120._12_4_ = fVar164;
                          auVar9 = vfmadd132ps_fma(auVar120,auVar13,local_288);
                          auVar13 = vshufps_avx(auVar106,auVar106,0xc9);
                          auVar138._0_4_ = auVar9._0_4_ * auVar13._0_4_;
                          auVar138._4_4_ = auVar9._4_4_ * auVar13._4_4_;
                          auVar138._8_4_ = auVar9._8_4_ * auVar13._8_4_;
                          auVar138._12_4_ = auVar9._12_4_ * auVar13._12_4_;
                          auVar13 = vshufps_avx(auVar9,auVar9,0xc9);
                          auVar9 = vfmsub231ps_fma(auVar138,auVar106,auVar13);
                          auVar13 = vshufps_avx(auVar9,auVar9,0xe9);
                          local_2e8 = vmovlps_avx(auVar13);
                          local_2e0 = auVar9._0_4_;
                          local_2dc = vmovlps_avx(auVar68);
                          local_2d4 = (int)local_338;
                          local_2d0 = (int)local_430;
                          local_2cc = context->user->instID[0];
                          local_2c8 = context->user->instPrimID[0];
                          ray->tfar = fVar66;
                          local_4ac = -1;
                          local_328.valid = &local_4ac;
                          local_328.geometryUserPtr = pGVar5->userPtr;
                          local_328.context = context->user;
                          local_328.hit = (RTCHitN *)&local_2e8;
                          local_328.N = 1;
                          local_328.ray = (RTCRayN *)ray;
                          if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0167f5ca:
                            p_Var6 = context->args->filter;
                            if (p_Var6 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var6)(&local_328);
                              }
                              if (*local_328.valid == 0) {
                                bVar59 = 0;
                                goto LAB_0167f724;
                              }
                            }
                            bVar59 = 1;
                          }
                          else {
                            stack0xfffffffffffffbdc = auVar14._4_28_;
                            local_428._0_4_ = (int)uVar62;
                            (*pGVar5->occlusionFilterN)(&local_328);
                            uVar62 = (ulong)(uint)local_428._0_4_;
                            if (*local_328.valid != 0) goto LAB_0167f5ca;
                            bVar59 = 0;
                          }
LAB_0167f724:
                          if (bVar59 == 0) {
                            ray->tfar = (float)local_408._0_4_;
                          }
                        }
                        uVar62 = CONCAT71((int7)(uVar62 >> 8),(byte)uVar62 | bVar59);
                      }
                    }
                  }
                }
                break;
              }
              lVar58 = lVar58 + -1;
            } while (lVar58 != 0);
          }
          else {
            bVar45 = false;
          }
        }
      }
      auVar278 = ZEXT464(0x3f800000);
      auVar13 = local_468._0_16_;
    } while (bVar45);
    local_468._0_16_ = auVar13;
    local_268 = vinsertps_avx(local_468._0_16_,ZEXT416((uint)local_488),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }